

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O1

void embree::avx512::CurveNiIntersectorK<8,8>::
     intersect_hn<embree::avx512::OrientedCurve1IntersectorK<embree::HermiteCurveT,8>,embree::avx512::Intersect1KEpilog1<8,true>>
               (Precalculations *pre,RayHitK<8> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar1;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar2;
  undefined1 auVar3 [16];
  Primitive PVar4;
  uint uVar5;
  uint uVar6;
  Geometry *pGVar7;
  long lVar8;
  __int_type_conflict _Var9;
  RTCFilterFunctionN p_Var10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  undefined8 uVar19;
  undefined8 uVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  int iVar30;
  int iVar31;
  int iVar32;
  int iVar33;
  int iVar34;
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  byte bVar37;
  uint uVar38;
  ulong uVar39;
  uint uVar41;
  uint uVar42;
  ulong uVar43;
  long lVar44;
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar61 [16];
  ulong uVar45;
  uint uVar46;
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar60 [16];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar97 [32];
  undefined1 auVar99 [32];
  undefined1 auVar101 [32];
  undefined1 auVar103 [32];
  undefined1 auVar105 [32];
  int iVar107;
  float t1;
  float fVar108;
  undefined1 auVar109 [16];
  float fVar110;
  float fVar111;
  undefined4 uVar112;
  float fVar122;
  float fVar123;
  float fVar124;
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  float fVar131;
  float fVar132;
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  vfloat4 a0_2;
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  vfloat4 b0;
  undefined1 auVar156 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar157 [16];
  undefined1 auVar161 [32];
  undefined1 auVar162 [32];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [32];
  vfloat4 a0_3;
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [32];
  __m128 a_1;
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [32];
  undefined1 auVar193 [32];
  undefined1 auVar194 [32];
  float fVar195;
  float fVar208;
  float fVar209;
  __m128 a;
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  float fVar210;
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  float fVar211;
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  float fVar218;
  float fVar228;
  float fVar229;
  vfloat4 a0_1;
  undefined1 auVar219 [16];
  float fVar230;
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  float fVar231;
  float fVar236;
  float fVar237;
  vfloat4 a0;
  undefined1 auVar232 [16];
  float fVar238;
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [32];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [32];
  undefined1 auVar246 [64];
  undefined1 auVar247 [64];
  undefined1 auVar248 [64];
  undefined1 auVar249 [64];
  undefined1 auVar250 [64];
  undefined1 auVar251 [64];
  undefined1 auVar252 [64];
  undefined1 auVar253 [64];
  int iVar254;
  undefined1 in_ZMM31 [64];
  undefined1 auVar255 [64];
  RTCFilterFunctionNArguments args;
  uint mask_stack [4];
  BBox1f cu_stack [4];
  BBox1f cv_stack [4];
  RTCFilterFunctionNArguments local_470;
  undefined1 local_440 [16];
  undefined1 local_430 [16];
  undefined1 local_420 [8];
  float fStack_418;
  float fStack_414;
  undefined1 local_410 [16];
  undefined1 local_400 [16];
  uint auStack_3f0 [4];
  undefined8 local_3e0;
  undefined8 uStack_3d8;
  undefined8 uStack_3d0;
  undefined8 uStack_3c8;
  undefined1 local_3c0 [8];
  float fStack_3b8;
  float fStack_3b4;
  undefined1 local_3b0 [16];
  undefined1 local_3a0 [16];
  undefined1 local_390 [16];
  undefined1 local_380 [8];
  float fStack_378;
  float fStack_374;
  undefined1 local_370 [8];
  float fStack_368;
  float fStack_364;
  undefined1 local_360 [16];
  undefined1 local_350 [16];
  undefined1 local_340 [8];
  float fStack_338;
  float fStack_334;
  undefined1 local_330 [16];
  undefined1 local_320 [8];
  float fStack_318;
  float fStack_314;
  undefined1 local_310 [16];
  undefined1 local_300 [16];
  undefined1 local_2f0 [16];
  undefined1 local_2e0 [16];
  undefined1 local_2d0 [16];
  undefined1 local_2c0 [16];
  undefined1 local_2b0 [16];
  undefined1 local_2a0 [16];
  undefined1 local_290 [16];
  uint uStack_280;
  float afStack_27c [7];
  undefined1 local_260 [32];
  undefined1 local_240 [32];
  undefined1 local_220 [32];
  undefined1 local_200 [32];
  undefined1 local_1e0 [32];
  undefined1 local_1c0 [32];
  ulong auStack_1a0 [4];
  RTCHitN local_180 [32];
  undefined1 local_160 [32];
  undefined4 local_140;
  undefined4 uStack_13c;
  undefined4 uStack_138;
  undefined4 uStack_134;
  undefined4 uStack_130;
  undefined4 uStack_12c;
  undefined4 uStack_128;
  undefined4 uStack_124;
  float local_120;
  float fStack_11c;
  float fStack_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float fStack_108;
  float fStack_104;
  undefined1 local_100 [32];
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined8 uStack_d0;
  undefined8 uStack_c8;
  undefined1 local_c0 [32];
  uint local_a0;
  uint uStack_9c;
  uint uStack_98;
  uint uStack_94;
  uint uStack_90;
  uint uStack_8c;
  uint uStack_88;
  uint uStack_84;
  uint local_80;
  uint uStack_7c;
  uint uStack_78;
  uint uStack_74;
  uint uStack_70;
  uint uStack_6c;
  uint uStack_68;
  uint uStack_64;
  ulong uVar40;
  undefined1 auVar96 [32];
  undefined1 auVar98 [32];
  undefined1 auVar100 [32];
  undefined1 auVar102 [32];
  undefined1 auVar104 [32];
  undefined1 auVar106 [32];
  
  PVar4 = prim[1];
  uVar43 = (ulong)(byte)PVar4;
  fVar132 = *(float *)(prim + uVar43 * 0x19 + 0x12);
  auVar47 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                          0x10);
  auVar47 = vinsertps_avx(auVar47,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x20);
  auVar56 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x80)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0xa0)),0x10);
  auVar48 = vinsertps_avx(auVar56,ZEXT416(*(uint *)(ray + k * 4 + 0xc0)),0x20);
  auVar50 = vsubps_avx(auVar47,*(undefined1 (*) [16])(prim + uVar43 * 0x19 + 6));
  fVar131 = fVar132 * auVar50._0_4_;
  fVar108 = fVar132 * auVar48._0_4_;
  auVar47._8_8_ = 0;
  auVar47._0_8_ = *(ulong *)(prim + uVar43 * 4 + 6);
  auVar79 = vpmovsxbd_avx2(auVar47);
  auVar56._8_8_ = 0;
  auVar56._0_8_ = *(ulong *)(prim + uVar43 * 5 + 6);
  auVar77 = vpmovsxbd_avx2(auVar56);
  auVar79 = vcvtdq2ps_avx(auVar79);
  auVar77 = vcvtdq2ps_avx(auVar77);
  auVar3._8_8_ = 0;
  auVar3._0_8_ = *(ulong *)(prim + uVar43 * 6 + 6);
  auVar90 = vpmovsxbd_avx2(auVar3);
  auVar90 = vcvtdq2ps_avx(auVar90);
  auVar57._8_8_ = 0;
  auVar57._0_8_ = *(ulong *)(prim + uVar43 * 0xb + 6);
  auVar91 = vpmovsxbd_avx2(auVar57);
  auVar58._8_8_ = 0;
  auVar58._0_8_ = *(ulong *)(prim + (ulong)((uint)(byte)PVar4 * 0xc) + 6);
  auVar84 = vpmovsxbd_avx2(auVar58);
  auVar91 = vcvtdq2ps_avx(auVar91);
  auVar80 = vcvtdq2ps_avx(auVar84);
  auVar53._8_8_ = 0;
  auVar53._0_8_ = *(ulong *)(prim + (uint)(byte)PVar4 * 0xc + uVar43 + 6);
  auVar78 = vpmovsxbd_avx2(auVar53);
  auVar78 = vcvtdq2ps_avx(auVar78);
  uVar45 = (ulong)(uint)((int)(uVar43 * 9) * 2);
  auVar59._8_8_ = 0;
  auVar59._0_8_ = *(ulong *)(prim + uVar45 + 6);
  auVar81 = vpmovsxbd_avx2(auVar59);
  auVar81 = vcvtdq2ps_avx(auVar81);
  auVar61._8_8_ = 0;
  auVar61._0_8_ = *(ulong *)(prim + uVar45 + uVar43 + 6);
  auVar82 = vpmovsxbd_avx2(auVar61);
  auVar82 = vcvtdq2ps_avx(auVar82);
  uVar39 = (ulong)(uint)((int)(uVar43 * 5) << 2);
  auVar49._8_8_ = 0;
  auVar49._0_8_ = *(ulong *)(prim + uVar39 + 6);
  auVar76 = vpmovsxbd_avx2(auVar49);
  auVar83 = vcvtdq2ps_avx(auVar76);
  auVar147._4_4_ = fVar108;
  auVar147._0_4_ = fVar108;
  auVar147._8_4_ = fVar108;
  auVar147._12_4_ = fVar108;
  auVar147._16_4_ = fVar108;
  auVar147._20_4_ = fVar108;
  auVar147._24_4_ = fVar108;
  auVar147._28_4_ = fVar108;
  auVar245._8_4_ = 1;
  auVar245._0_8_ = 0x100000001;
  auVar245._12_4_ = 1;
  auVar245._16_4_ = 1;
  auVar245._20_4_ = 1;
  auVar245._24_4_ = 1;
  auVar245._28_4_ = 1;
  auVar74 = vbroadcastss_avx512vl(ZEXT416(2));
  auVar253 = ZEXT3264(auVar74);
  auVar86 = ZEXT1632(CONCAT412(fVar132 * auVar48._12_4_,
                               CONCAT48(fVar132 * auVar48._8_4_,
                                        CONCAT44(fVar132 * auVar48._4_4_,fVar108))));
  auVar85 = vpermps_avx2(auVar245,auVar86);
  auVar75 = vpermps_avx512vl(auVar74,auVar86);
  fVar108 = auVar75._0_4_;
  fVar195 = auVar75._4_4_;
  auVar86._4_4_ = fVar195 * auVar90._4_4_;
  auVar86._0_4_ = fVar108 * auVar90._0_4_;
  fVar208 = auVar75._8_4_;
  auVar86._8_4_ = fVar208 * auVar90._8_4_;
  fVar209 = auVar75._12_4_;
  auVar86._12_4_ = fVar209 * auVar90._12_4_;
  fVar110 = auVar75._16_4_;
  auVar86._16_4_ = fVar110 * auVar90._16_4_;
  fVar111 = auVar75._20_4_;
  auVar86._20_4_ = fVar111 * auVar90._20_4_;
  fVar210 = auVar75._24_4_;
  auVar86._24_4_ = fVar210 * auVar90._24_4_;
  auVar86._28_4_ = auVar84._28_4_;
  auVar84._4_4_ = auVar78._4_4_ * fVar195;
  auVar84._0_4_ = auVar78._0_4_ * fVar108;
  auVar84._8_4_ = auVar78._8_4_ * fVar208;
  auVar84._12_4_ = auVar78._12_4_ * fVar209;
  auVar84._16_4_ = auVar78._16_4_ * fVar110;
  auVar84._20_4_ = auVar78._20_4_ * fVar111;
  auVar84._24_4_ = auVar78._24_4_ * fVar210;
  auVar84._28_4_ = auVar76._28_4_;
  auVar76._4_4_ = auVar83._4_4_ * fVar195;
  auVar76._0_4_ = auVar83._0_4_ * fVar108;
  auVar76._8_4_ = auVar83._8_4_ * fVar208;
  auVar76._12_4_ = auVar83._12_4_ * fVar209;
  auVar76._16_4_ = auVar83._16_4_ * fVar110;
  auVar76._20_4_ = auVar83._20_4_ * fVar111;
  auVar76._24_4_ = auVar83._24_4_ * fVar210;
  auVar76._28_4_ = auVar75._28_4_;
  auVar47 = vfmadd231ps_fma(auVar86,auVar85,auVar77);
  auVar56 = vfmadd231ps_fma(auVar84,auVar85,auVar80);
  auVar3 = vfmadd231ps_fma(auVar76,auVar82,auVar85);
  auVar47 = vfmadd231ps_fma(ZEXT1632(auVar47),auVar147,auVar79);
  auVar56 = vfmadd231ps_fma(ZEXT1632(auVar56),auVar147,auVar91);
  auVar3 = vfmadd231ps_fma(ZEXT1632(auVar3),auVar81,auVar147);
  auVar235._4_4_ = fVar131;
  auVar235._0_4_ = fVar131;
  auVar235._8_4_ = fVar131;
  auVar235._12_4_ = fVar131;
  auVar235._16_4_ = fVar131;
  auVar235._20_4_ = fVar131;
  auVar235._24_4_ = fVar131;
  auVar235._28_4_ = fVar131;
  auVar76 = ZEXT1632(CONCAT412(fVar132 * auVar50._12_4_,
                               CONCAT48(fVar132 * auVar50._8_4_,
                                        CONCAT44(fVar132 * auVar50._4_4_,fVar131))));
  auVar84 = vpermps_avx2(auVar245,auVar76);
  auVar76 = vpermps_avx512vl(auVar74,auVar76);
  fVar132 = auVar76._0_4_;
  fVar108 = auVar76._4_4_;
  auVar85._4_4_ = fVar108 * auVar90._4_4_;
  auVar85._0_4_ = fVar132 * auVar90._0_4_;
  fVar195 = auVar76._8_4_;
  auVar85._8_4_ = fVar195 * auVar90._8_4_;
  fVar208 = auVar76._12_4_;
  auVar85._12_4_ = fVar208 * auVar90._12_4_;
  fVar209 = auVar76._16_4_;
  auVar85._16_4_ = fVar209 * auVar90._16_4_;
  fVar110 = auVar76._20_4_;
  auVar85._20_4_ = fVar110 * auVar90._20_4_;
  fVar111 = auVar76._24_4_;
  auVar85._24_4_ = fVar111 * auVar90._24_4_;
  auVar85._28_4_ = 1;
  auVar74._4_4_ = auVar78._4_4_ * fVar108;
  auVar74._0_4_ = auVar78._0_4_ * fVar132;
  auVar74._8_4_ = auVar78._8_4_ * fVar195;
  auVar74._12_4_ = auVar78._12_4_ * fVar208;
  auVar74._16_4_ = auVar78._16_4_ * fVar209;
  auVar74._20_4_ = auVar78._20_4_ * fVar110;
  auVar74._24_4_ = auVar78._24_4_ * fVar111;
  auVar74._28_4_ = auVar90._28_4_;
  auVar78._4_4_ = auVar83._4_4_ * fVar108;
  auVar78._0_4_ = auVar83._0_4_ * fVar132;
  auVar78._8_4_ = auVar83._8_4_ * fVar195;
  auVar78._12_4_ = auVar83._12_4_ * fVar208;
  auVar78._16_4_ = auVar83._16_4_ * fVar209;
  auVar78._20_4_ = auVar83._20_4_ * fVar110;
  auVar78._24_4_ = auVar83._24_4_ * fVar111;
  auVar78._28_4_ = auVar76._28_4_;
  auVar57 = vfmadd231ps_fma(auVar85,auVar84,auVar77);
  auVar58 = vfmadd231ps_fma(auVar74,auVar84,auVar80);
  auVar53 = vfmadd231ps_fma(auVar78,auVar84,auVar82);
  auVar57 = vfmadd231ps_fma(ZEXT1632(auVar57),auVar235,auVar79);
  auVar58 = vfmadd231ps_fma(ZEXT1632(auVar58),auVar235,auVar91);
  auVar93._8_4_ = 0x7fffffff;
  auVar93._0_8_ = 0x7fffffff7fffffff;
  auVar93._12_4_ = 0x7fffffff;
  auVar93._16_4_ = 0x7fffffff;
  auVar93._20_4_ = 0x7fffffff;
  auVar93._24_4_ = 0x7fffffff;
  auVar93._28_4_ = 0x7fffffff;
  auVar53 = vfmadd231ps_fma(ZEXT1632(auVar53),auVar235,auVar81);
  auVar79 = vandps_avx(ZEXT1632(auVar47),auVar93);
  auVar140._8_4_ = 0x219392ef;
  auVar140._0_8_ = 0x219392ef219392ef;
  auVar140._12_4_ = 0x219392ef;
  auVar140._16_4_ = 0x219392ef;
  auVar140._20_4_ = 0x219392ef;
  auVar140._24_4_ = 0x219392ef;
  auVar140._28_4_ = 0x219392ef;
  uVar45 = vcmpps_avx512vl(auVar79,auVar140,1);
  bVar11 = (bool)((byte)uVar45 & 1);
  auVar75._0_4_ = (uint)bVar11 * 0x219392ef | (uint)!bVar11 * auVar47._0_4_;
  bVar11 = (bool)((byte)(uVar45 >> 1) & 1);
  auVar75._4_4_ = (uint)bVar11 * 0x219392ef | (uint)!bVar11 * auVar47._4_4_;
  bVar11 = (bool)((byte)(uVar45 >> 2) & 1);
  auVar75._8_4_ = (uint)bVar11 * 0x219392ef | (uint)!bVar11 * auVar47._8_4_;
  bVar11 = (bool)((byte)(uVar45 >> 3) & 1);
  auVar75._12_4_ = (uint)bVar11 * 0x219392ef | (uint)!bVar11 * auVar47._12_4_;
  auVar75._16_4_ = (uint)((byte)(uVar45 >> 4) & 1) * 0x219392ef;
  auVar75._20_4_ = (uint)((byte)(uVar45 >> 5) & 1) * 0x219392ef;
  auVar75._24_4_ = (uint)((byte)(uVar45 >> 6) & 1) * 0x219392ef;
  auVar75._28_4_ = (uint)(byte)(uVar45 >> 7) * 0x219392ef;
  auVar79 = vandps_avx(ZEXT1632(auVar56),auVar93);
  uVar45 = vcmpps_avx512vl(auVar79,auVar140,1);
  bVar11 = (bool)((byte)uVar45 & 1);
  auVar87._0_4_ = (uint)bVar11 * 0x219392ef | (uint)!bVar11 * auVar56._0_4_;
  bVar11 = (bool)((byte)(uVar45 >> 1) & 1);
  auVar87._4_4_ = (uint)bVar11 * 0x219392ef | (uint)!bVar11 * auVar56._4_4_;
  bVar11 = (bool)((byte)(uVar45 >> 2) & 1);
  auVar87._8_4_ = (uint)bVar11 * 0x219392ef | (uint)!bVar11 * auVar56._8_4_;
  bVar11 = (bool)((byte)(uVar45 >> 3) & 1);
  auVar87._12_4_ = (uint)bVar11 * 0x219392ef | (uint)!bVar11 * auVar56._12_4_;
  auVar87._16_4_ = (uint)((byte)(uVar45 >> 4) & 1) * 0x219392ef;
  auVar87._20_4_ = (uint)((byte)(uVar45 >> 5) & 1) * 0x219392ef;
  auVar87._24_4_ = (uint)((byte)(uVar45 >> 6) & 1) * 0x219392ef;
  auVar87._28_4_ = (uint)(byte)(uVar45 >> 7) * 0x219392ef;
  auVar79 = vandps_avx(ZEXT1632(auVar3),auVar93);
  uVar45 = vcmpps_avx512vl(auVar79,auVar140,1);
  bVar11 = (bool)((byte)uVar45 & 1);
  auVar79._0_4_ = (uint)bVar11 * 0x219392ef | (uint)!bVar11 * auVar3._0_4_;
  bVar11 = (bool)((byte)(uVar45 >> 1) & 1);
  auVar79._4_4_ = (uint)bVar11 * 0x219392ef | (uint)!bVar11 * auVar3._4_4_;
  bVar11 = (bool)((byte)(uVar45 >> 2) & 1);
  auVar79._8_4_ = (uint)bVar11 * 0x219392ef | (uint)!bVar11 * auVar3._8_4_;
  bVar11 = (bool)((byte)(uVar45 >> 3) & 1);
  auVar79._12_4_ = (uint)bVar11 * 0x219392ef | (uint)!bVar11 * auVar3._12_4_;
  auVar79._16_4_ = (uint)((byte)(uVar45 >> 4) & 1) * 0x219392ef;
  auVar79._20_4_ = (uint)((byte)(uVar45 >> 5) & 1) * 0x219392ef;
  auVar79._24_4_ = (uint)((byte)(uVar45 >> 6) & 1) * 0x219392ef;
  auVar79._28_4_ = (uint)(byte)(uVar45 >> 7) * 0x219392ef;
  auVar77 = vrcp14ps_avx512vl(auVar75);
  auVar94._8_4_ = 0x3f800000;
  auVar94._0_8_ = &DAT_3f8000003f800000;
  auVar94._12_4_ = 0x3f800000;
  auVar94._16_4_ = 0x3f800000;
  auVar94._20_4_ = 0x3f800000;
  auVar94._24_4_ = 0x3f800000;
  auVar94._28_4_ = 0x3f800000;
  auVar47 = vfnmadd213ps_fma(auVar75,auVar77,auVar94);
  auVar47 = vfmadd132ps_fma(ZEXT1632(auVar47),auVar77,auVar77);
  auVar77 = vrcp14ps_avx512vl(auVar87);
  auVar56 = vfnmadd213ps_fma(auVar87,auVar77,auVar94);
  auVar56 = vfmadd132ps_fma(ZEXT1632(auVar56),auVar77,auVar77);
  auVar77 = vrcp14ps_avx512vl(auVar79);
  auVar3 = vfnmadd213ps_fma(auVar79,auVar77,auVar94);
  auVar3 = vfmadd132ps_fma(ZEXT1632(auVar3),auVar77,auVar77);
  auVar79 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar43 * 7 + 6));
  auVar79 = vcvtdq2ps_avx(auVar79);
  auVar79 = vsubps_avx(auVar79,ZEXT1632(auVar57));
  auVar81._4_4_ = auVar47._4_4_ * auVar79._4_4_;
  auVar81._0_4_ = auVar47._0_4_ * auVar79._0_4_;
  auVar81._8_4_ = auVar47._8_4_ * auVar79._8_4_;
  auVar81._12_4_ = auVar47._12_4_ * auVar79._12_4_;
  auVar81._16_4_ = auVar79._16_4_ * 0.0;
  auVar81._20_4_ = auVar79._20_4_ * 0.0;
  auVar81._24_4_ = auVar79._24_4_ * 0.0;
  auVar81._28_4_ = auVar79._28_4_;
  auVar79 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar43 * 9 + 6));
  auVar79 = vcvtdq2ps_avx(auVar79);
  auVar79 = vsubps_avx(auVar79,ZEXT1632(auVar57));
  auVar78 = vpbroadcastd_avx512vl();
  auVar77 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + (ulong)(byte)PVar4 * 0x10 + 6));
  auVar92._0_4_ = auVar47._0_4_ * auVar79._0_4_;
  auVar92._4_4_ = auVar47._4_4_ * auVar79._4_4_;
  auVar92._8_4_ = auVar47._8_4_ * auVar79._8_4_;
  auVar92._12_4_ = auVar47._12_4_ * auVar79._12_4_;
  auVar92._16_4_ = auVar79._16_4_ * 0.0;
  auVar92._20_4_ = auVar79._20_4_ * 0.0;
  auVar92._24_4_ = auVar79._24_4_ * 0.0;
  auVar92._28_4_ = 0;
  auVar79 = vpmovsxwd_avx2(*(undefined1 (*) [16])
                            (prim + (ulong)(byte)PVar4 * 0x10 + uVar43 * -2 + 6));
  auVar79 = vcvtdq2ps_avx(auVar79);
  auVar79 = vsubps_avx(auVar79,ZEXT1632(auVar58));
  auVar82._4_4_ = auVar56._4_4_ * auVar79._4_4_;
  auVar82._0_4_ = auVar56._0_4_ * auVar79._0_4_;
  auVar82._8_4_ = auVar56._8_4_ * auVar79._8_4_;
  auVar82._12_4_ = auVar56._12_4_ * auVar79._12_4_;
  auVar82._16_4_ = auVar79._16_4_ * 0.0;
  auVar82._20_4_ = auVar79._20_4_ * 0.0;
  auVar82._24_4_ = auVar79._24_4_ * 0.0;
  auVar82._28_4_ = auVar79._28_4_;
  auVar79 = vcvtdq2ps_avx(auVar77);
  auVar79 = vsubps_avx(auVar79,ZEXT1632(auVar58));
  auVar89._0_4_ = auVar56._0_4_ * auVar79._0_4_;
  auVar89._4_4_ = auVar56._4_4_ * auVar79._4_4_;
  auVar89._8_4_ = auVar56._8_4_ * auVar79._8_4_;
  auVar89._12_4_ = auVar56._12_4_ * auVar79._12_4_;
  auVar89._16_4_ = auVar79._16_4_ * 0.0;
  auVar89._20_4_ = auVar79._20_4_ * 0.0;
  auVar89._24_4_ = auVar79._24_4_ * 0.0;
  auVar89._28_4_ = 0;
  auVar79 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar39 + uVar43 + 6));
  auVar79 = vcvtdq2ps_avx(auVar79);
  auVar79 = vsubps_avx(auVar79,ZEXT1632(auVar53));
  auVar83._4_4_ = auVar79._4_4_ * auVar3._4_4_;
  auVar83._0_4_ = auVar79._0_4_ * auVar3._0_4_;
  auVar83._8_4_ = auVar79._8_4_ * auVar3._8_4_;
  auVar83._12_4_ = auVar79._12_4_ * auVar3._12_4_;
  auVar83._16_4_ = auVar79._16_4_ * 0.0;
  auVar83._20_4_ = auVar79._20_4_ * 0.0;
  auVar83._24_4_ = auVar79._24_4_ * 0.0;
  auVar83._28_4_ = auVar79._28_4_;
  auVar79 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar43 * 0x17 + 6));
  auVar79 = vcvtdq2ps_avx(auVar79);
  auVar79 = vsubps_avx(auVar79,ZEXT1632(auVar53));
  auVar88._0_4_ = auVar3._0_4_ * auVar79._0_4_;
  auVar88._4_4_ = auVar3._4_4_ * auVar79._4_4_;
  auVar88._8_4_ = auVar3._8_4_ * auVar79._8_4_;
  auVar88._12_4_ = auVar3._12_4_ * auVar79._12_4_;
  auVar88._16_4_ = auVar79._16_4_ * 0.0;
  auVar88._20_4_ = auVar79._20_4_ * 0.0;
  auVar88._24_4_ = auVar79._24_4_ * 0.0;
  auVar88._28_4_ = 0;
  auVar79 = vpminsd_avx2(auVar81,auVar92);
  auVar77 = vpminsd_avx2(auVar82,auVar89);
  auVar79 = vmaxps_avx(auVar79,auVar77);
  auVar77 = vpminsd_avx2(auVar83,auVar88);
  uVar112 = *(undefined4 *)(ray + k * 4 + 0x60);
  auVar90._4_4_ = uVar112;
  auVar90._0_4_ = uVar112;
  auVar90._8_4_ = uVar112;
  auVar90._12_4_ = uVar112;
  auVar90._16_4_ = uVar112;
  auVar90._20_4_ = uVar112;
  auVar90._24_4_ = uVar112;
  auVar90._28_4_ = uVar112;
  auVar77 = vmaxps_avx512vl(auVar77,auVar90);
  auVar79 = vmaxps_avx(auVar79,auVar77);
  auVar77._8_4_ = 0x3f7ffffa;
  auVar77._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar77._12_4_ = 0x3f7ffffa;
  auVar77._16_4_ = 0x3f7ffffa;
  auVar77._20_4_ = 0x3f7ffffa;
  auVar77._24_4_ = 0x3f7ffffa;
  auVar77._28_4_ = 0x3f7ffffa;
  local_200 = vmulps_avx512vl(auVar79,auVar77);
  auVar79 = vpmaxsd_avx2(auVar81,auVar92);
  auVar77 = vpmaxsd_avx2(auVar82,auVar89);
  auVar79 = vminps_avx(auVar79,auVar77);
  auVar77 = vpmaxsd_avx2(auVar83,auVar88);
  uVar112 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar91._4_4_ = uVar112;
  auVar91._0_4_ = uVar112;
  auVar91._8_4_ = uVar112;
  auVar91._12_4_ = uVar112;
  auVar91._16_4_ = uVar112;
  auVar91._20_4_ = uVar112;
  auVar91._24_4_ = uVar112;
  auVar91._28_4_ = uVar112;
  auVar77 = vminps_avx512vl(auVar77,auVar91);
  auVar79 = vminps_avx(auVar79,auVar77);
  auVar80._8_4_ = 0x3f800003;
  auVar80._0_8_ = 0x3f8000033f800003;
  auVar80._12_4_ = 0x3f800003;
  auVar80._16_4_ = 0x3f800003;
  auVar80._20_4_ = 0x3f800003;
  auVar80._24_4_ = 0x3f800003;
  auVar80._28_4_ = 0x3f800003;
  auVar79 = vmulps_avx512vl(auVar79,auVar80);
  uVar20 = vpcmpgtd_avx512vl(auVar78,_DAT_0205a920);
  uVar19 = vcmpps_avx512vl(local_200,auVar79,2);
  if ((byte)((byte)uVar19 & (byte)uVar20) == 0) {
    return;
  }
  uVar45 = (ulong)(byte)((byte)uVar19 & (byte)uVar20);
  local_260 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
  auVar47 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
  auVar247 = ZEXT1664(auVar47);
  auVar47 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
  auVar249 = ZEXT1664(auVar47);
  auVar47 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
  auVar250 = ZEXT1664(auVar47);
  auVar47 = vxorps_avx512vl(in_ZMM31._0_16_,in_ZMM31._0_16_);
  auVar255 = ZEXT1664(auVar47);
LAB_01d9c186:
  lVar44 = 0;
  for (uVar39 = uVar45; (uVar39 & 1) == 0; uVar39 = uVar39 >> 1 | 0x8000000000000000) {
    lVar44 = lVar44 + 1;
  }
  uVar46 = *(uint *)(prim + 2);
  uVar5 = *(uint *)(prim + lVar44 * 4 + 6);
  pGVar7 = (context->scene->geometries).items[uVar46].ptr;
  lVar8 = *(long *)&pGVar7[1].time_range.upper;
  uVar39 = (ulong)*(uint *)(*(long *)&pGVar7->field_0x58 +
                           (ulong)uVar5 *
                           pGVar7[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i);
  auVar47 = *(undefined1 (*) [16])(lVar8 + (long)pGVar7[1].intersectionFilterN * uVar39);
  lVar44 = uVar39 + 1;
  auVar56 = *(undefined1 (*) [16])(lVar8 + (long)pGVar7[1].intersectionFilterN * lVar44);
  _Var9 = pGVar7[2].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  auVar3 = *(undefined1 (*) [16])(_Var9 + (long)pGVar7[2].userPtr * uVar39);
  auVar57 = *(undefined1 (*) [16])(_Var9 + (long)pGVar7[2].userPtr * lVar44);
  auVar58 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                          0x1c);
  auVar58 = vinsertps_avx(auVar58,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x28);
  fVar132 = *(float *)(ray + k * 4 + 0x60);
  auVar48 = vbroadcastss_avx512vl(ZEXT416(0x3eaaaaab));
  auVar49 = vfmadd132ps_avx512vl
                      (*(undefined1 (*) [16])
                        (pGVar7[2].intersectionFilterN + (long)pGVar7[2].pointQueryFunc * uVar39),
                       auVar47,auVar48);
  auVar50 = vfnmadd132ps_avx512vl
                      (*(undefined1 (*) [16])
                        (pGVar7[2].intersectionFilterN + (long)pGVar7[2].pointQueryFunc * lVar44),
                       auVar56,auVar48);
  auVar51 = vfmadd132ps_avx512vl
                      (*(undefined1 (*) [16])
                        ((long)pGVar7[3].userPtr + uVar39 * *(long *)&pGVar7[3].fnumTimeSegments),
                       auVar3,auVar48);
  auVar52 = vfnmadd132ps_avx512vl
                      (*(undefined1 (*) [16])
                        ((long)pGVar7[3].userPtr + *(long *)&pGVar7[3].fnumTimeSegments * lVar44),
                       auVar57,auVar48);
  auVar113 = ZEXT816(0) << 0x40;
  auVar55._0_4_ = auVar56._0_4_ * 0.0;
  auVar55._4_4_ = auVar56._4_4_ * 0.0;
  auVar55._8_4_ = auVar56._8_4_ * 0.0;
  auVar55._12_4_ = auVar56._12_4_ * 0.0;
  auVar59 = vfmadd231ps_fma(auVar55,auVar50,auVar113);
  auVar53 = vfmadd213ps_fma(ZEXT816(0) << 0x40,auVar49,auVar59);
  auVar60._0_4_ = auVar47._0_4_ + auVar53._0_4_;
  auVar60._4_4_ = auVar47._4_4_ + auVar53._4_4_;
  auVar60._8_4_ = auVar47._8_4_ + auVar53._8_4_;
  auVar60._12_4_ = auVar47._12_4_ + auVar53._12_4_;
  auVar62 = auVar247._0_16_;
  auVar53 = vfmadd231ps_avx512vl(auVar59,auVar49,auVar62);
  auVar54 = vfnmadd231ps_avx512vl(auVar53,auVar47,auVar62);
  auVar219._0_4_ = auVar57._0_4_ * 0.0;
  auVar219._4_4_ = auVar57._4_4_ * 0.0;
  auVar219._8_4_ = auVar57._8_4_ * 0.0;
  auVar219._12_4_ = auVar57._12_4_ * 0.0;
  auVar59 = vfmadd231ps_fma(auVar219,auVar52,auVar113);
  auVar53 = vfmadd213ps_fma(ZEXT816(0) << 0x40,auVar51,auVar59);
  auVar232._0_4_ = auVar3._0_4_ + auVar53._0_4_;
  auVar232._4_4_ = auVar3._4_4_ + auVar53._4_4_;
  auVar232._8_4_ = auVar3._8_4_ + auVar53._8_4_;
  auVar232._12_4_ = auVar3._12_4_ + auVar53._12_4_;
  auVar53 = vfmadd231ps_avx512vl(auVar59,auVar51,auVar62);
  auVar55 = vfnmadd231ps_avx512vl(auVar53,auVar3,auVar62);
  auVar53 = vfmadd213ps_fma(ZEXT816(0) << 0x20,auVar50,auVar56);
  auVar53 = vfmadd231ps_fma(auVar53,auVar49,auVar113);
  auVar61 = vfmadd231ps_fma(auVar53,auVar47,auVar113);
  auVar56 = vmulps_avx512vl(auVar56,auVar62);
  auVar56 = vfnmadd231ps_avx512vl(auVar56,auVar62,auVar50);
  auVar56 = vfmadd231ps_fma(auVar56,auVar113,auVar49);
  auVar49 = vfnmadd231ps_fma(auVar56,auVar113,auVar47);
  auVar47 = vfmadd213ps_fma(ZEXT816(0) << 0x20,auVar52,auVar57);
  auVar47 = vfmadd231ps_fma(auVar47,auVar51,auVar113);
  auVar53 = vfmadd231ps_fma(auVar47,auVar3,auVar113);
  auVar47 = vmulps_avx512vl(auVar57,auVar62);
  auVar47 = vfnmadd231ps_avx512vl(auVar47,auVar62,auVar52);
  auVar47 = vfmadd231ps_fma(auVar47,auVar113,auVar51);
  auVar59 = vfnmadd231ps_fma(auVar47,auVar113,auVar3);
  auVar47 = vshufps_avx(auVar54,auVar54,0xc9);
  auVar56 = vshufps_avx(auVar232,auVar232,0xc9);
  fVar211 = auVar54._0_4_;
  auVar67._0_4_ = fVar211 * auVar56._0_4_;
  fVar122 = auVar54._4_4_;
  auVar67._4_4_ = fVar122 * auVar56._4_4_;
  fVar123 = auVar54._8_4_;
  auVar67._8_4_ = fVar123 * auVar56._8_4_;
  fVar124 = auVar54._12_4_;
  auVar67._12_4_ = fVar124 * auVar56._12_4_;
  auVar56 = vfmsub231ps_fma(auVar67,auVar47,auVar232);
  auVar3 = vshufps_avx(auVar56,auVar56,0xc9);
  auVar56 = vshufps_avx(auVar55,auVar55,0xc9);
  auVar187._0_4_ = auVar56._0_4_ * fVar211;
  auVar187._4_4_ = auVar56._4_4_ * fVar122;
  auVar187._8_4_ = auVar56._8_4_ * fVar123;
  auVar187._12_4_ = auVar56._12_4_ * fVar124;
  auVar47 = vfmsub231ps_fma(auVar187,auVar47,auVar55);
  auVar57 = vshufps_avx(auVar47,auVar47,0xc9);
  auVar47 = vshufps_avx(auVar49,auVar49,0xc9);
  auVar56 = vshufps_avx(auVar53,auVar53,0xc9);
  fVar108 = auVar49._0_4_;
  auVar196._0_4_ = auVar56._0_4_ * fVar108;
  fVar195 = auVar49._4_4_;
  auVar196._4_4_ = auVar56._4_4_ * fVar195;
  fVar208 = auVar49._8_4_;
  auVar196._8_4_ = auVar56._8_4_ * fVar208;
  fVar209 = auVar49._12_4_;
  auVar196._12_4_ = auVar56._12_4_ * fVar209;
  auVar56 = vfmsub231ps_fma(auVar196,auVar47,auVar53);
  auVar53 = vshufps_avx(auVar56,auVar56,0xc9);
  auVar56 = vshufps_avx(auVar59,auVar59,0xc9);
  auVar197._0_4_ = auVar56._0_4_ * fVar108;
  auVar197._4_4_ = auVar56._4_4_ * fVar195;
  auVar197._8_4_ = auVar56._8_4_ * fVar208;
  auVar197._12_4_ = auVar56._12_4_ * fVar209;
  auVar47 = vfmsub231ps_fma(auVar197,auVar47,auVar59);
  auVar59 = vshufps_avx(auVar47,auVar47,0xc9);
  auVar47 = vdpps_avx(auVar3,auVar3,0x7f);
  fVar110 = auVar47._0_4_;
  auVar198._4_12_ = ZEXT812(0) << 0x20;
  auVar198._0_4_ = fVar110;
  auVar56 = vrsqrt14ss_avx512f(auVar113,auVar198);
  auVar50 = vmulss_avx512f(auVar56,ZEXT416(0x3fc00000));
  auVar51 = vmulss_avx512f(auVar47,ZEXT416(0x3f000000));
  fVar111 = auVar56._0_4_;
  fVar210 = auVar50._0_4_ - auVar51._0_4_ * fVar111 * fVar111 * fVar111;
  auVar56 = vdpps_avx(auVar3,auVar57,0x7f);
  fVar231 = fVar210 * auVar3._0_4_;
  fVar236 = fVar210 * auVar3._4_4_;
  fVar237 = fVar210 * auVar3._8_4_;
  fVar238 = fVar210 * auVar3._12_4_;
  auVar188._0_4_ = fVar110 * auVar57._0_4_;
  auVar188._4_4_ = fVar110 * auVar57._4_4_;
  auVar188._8_4_ = fVar110 * auVar57._8_4_;
  auVar188._12_4_ = fVar110 * auVar57._12_4_;
  fVar110 = auVar56._0_4_;
  auVar68._0_4_ = fVar110 * auVar3._0_4_;
  auVar68._4_4_ = fVar110 * auVar3._4_4_;
  auVar68._8_4_ = fVar110 * auVar3._8_4_;
  auVar68._12_4_ = fVar110 * auVar3._12_4_;
  auVar3 = vsubps_avx(auVar188,auVar68);
  auVar56 = vrcp14ss_avx512f(auVar113,auVar198);
  auVar47 = vfnmadd213ss_avx512f(auVar47,auVar56,ZEXT416(0x40000000));
  fVar110 = auVar56._0_4_ * auVar47._0_4_;
  auVar47 = vdpps_avx(auVar53,auVar53,0x7f);
  fVar111 = auVar47._0_4_;
  auVar189._4_12_ = ZEXT812(0) << 0x20;
  auVar189._0_4_ = fVar111;
  auVar56 = vrsqrt14ss_avx512f(auVar113,auVar189);
  auVar57 = vmulss_avx512f(auVar56,ZEXT416(0x3fc00000));
  auVar50 = vmulss_avx512f(auVar47,ZEXT416(0x3f000000));
  fVar131 = auVar56._0_4_;
  fVar131 = auVar57._0_4_ - auVar50._0_4_ * fVar131 * fVar131 * fVar131;
  auVar56 = vdpps_avx(auVar53,auVar59,0x7f);
  fVar218 = fVar131 * auVar53._0_4_;
  fVar228 = fVar131 * auVar53._4_4_;
  fVar229 = fVar131 * auVar53._8_4_;
  fVar230 = fVar131 * auVar53._12_4_;
  auVar69._0_4_ = fVar111 * auVar59._0_4_;
  auVar69._4_4_ = fVar111 * auVar59._4_4_;
  auVar69._8_4_ = fVar111 * auVar59._8_4_;
  auVar69._12_4_ = fVar111 * auVar59._12_4_;
  fVar111 = auVar56._0_4_;
  auVar71._0_4_ = fVar111 * auVar53._0_4_;
  auVar71._4_4_ = fVar111 * auVar53._4_4_;
  auVar71._8_4_ = fVar111 * auVar53._8_4_;
  auVar71._12_4_ = fVar111 * auVar53._12_4_;
  auVar57 = vsubps_avx(auVar69,auVar71);
  auVar56 = vrcp14ss_avx512f(auVar113,auVar189);
  auVar47 = vfnmadd213ss_avx512f(auVar47,auVar56,ZEXT416(0x40000000));
  fVar111 = auVar47._0_4_ * auVar56._0_4_;
  auVar47 = vshufps_avx(auVar60,auVar60,0xff);
  auVar172._0_4_ = fVar231 * auVar47._0_4_;
  auVar172._4_4_ = fVar236 * auVar47._4_4_;
  auVar172._8_4_ = fVar237 * auVar47._8_4_;
  auVar172._12_4_ = fVar238 * auVar47._12_4_;
  local_310 = vsubps_avx(auVar60,auVar172);
  auVar56 = vshufps_avx(auVar54,auVar54,0xff);
  auVar64._0_4_ = auVar56._0_4_ * fVar231 + auVar47._0_4_ * fVar210 * fVar110 * auVar3._0_4_;
  auVar64._4_4_ = auVar56._4_4_ * fVar236 + auVar47._4_4_ * fVar210 * fVar110 * auVar3._4_4_;
  auVar64._8_4_ = auVar56._8_4_ * fVar237 + auVar47._8_4_ * fVar210 * fVar110 * auVar3._8_4_;
  auVar64._12_4_ = auVar56._12_4_ * fVar238 + auVar47._12_4_ * fVar210 * fVar110 * auVar3._12_4_;
  auVar3 = vsubps_avx(auVar54,auVar64);
  local_320._0_4_ = auVar172._0_4_ + auVar60._0_4_;
  local_320._4_4_ = auVar172._4_4_ + auVar60._4_4_;
  fStack_318 = auVar172._8_4_ + auVar60._8_4_;
  fStack_314 = auVar172._12_4_ + auVar60._12_4_;
  auVar50._0_4_ = fVar211 + auVar64._0_4_;
  auVar50._4_4_ = fVar122 + auVar64._4_4_;
  auVar50._8_4_ = fVar123 + auVar64._8_4_;
  auVar50._12_4_ = fVar124 + auVar64._12_4_;
  auVar47 = vshufps_avx(auVar61,auVar61,0xff);
  auVar65._0_4_ = fVar218 * auVar47._0_4_;
  auVar65._4_4_ = fVar228 * auVar47._4_4_;
  auVar65._8_4_ = fVar229 * auVar47._8_4_;
  auVar65._12_4_ = fVar230 * auVar47._12_4_;
  local_330 = vsubps_avx(auVar61,auVar65);
  auVar56 = vshufps_avx(auVar49,auVar49,0xff);
  auVar51._0_4_ = auVar56._0_4_ * fVar218 + auVar47._0_4_ * fVar131 * auVar57._0_4_ * fVar111;
  auVar51._4_4_ = auVar56._4_4_ * fVar228 + auVar47._4_4_ * fVar131 * auVar57._4_4_ * fVar111;
  auVar51._8_4_ = auVar56._8_4_ * fVar229 + auVar47._8_4_ * fVar131 * auVar57._8_4_ * fVar111;
  auVar51._12_4_ = auVar56._12_4_ * fVar230 + auVar47._12_4_ * fVar131 * auVar57._12_4_ * fVar111;
  auVar47 = vsubps_avx(auVar49,auVar51);
  _local_340 = vaddps_avx512vl(auVar61,auVar65);
  auVar52._0_4_ = fVar108 + auVar51._0_4_;
  auVar52._4_4_ = fVar195 + auVar51._4_4_;
  auVar52._8_4_ = fVar208 + auVar51._8_4_;
  auVar52._12_4_ = fVar209 + auVar51._12_4_;
  auVar56 = vmulps_avx512vl(auVar3,auVar48);
  local_350 = vaddps_avx512vl(local_310,auVar56);
  auVar47 = vmulps_avx512vl(auVar47,auVar48);
  local_360 = vsubps_avx512vl(local_330,auVar47);
  auVar47 = vmulps_avx512vl(auVar50,auVar48);
  _local_370 = vaddps_avx512vl(_local_320,auVar47);
  auVar47 = vmulps_avx512vl(auVar52,auVar48);
  _local_380 = vsubps_avx512vl(_local_340,auVar47);
  local_290 = vsubps_avx(local_310,auVar58);
  uVar112 = local_290._0_4_;
  auVar62._4_4_ = uVar112;
  auVar62._0_4_ = uVar112;
  auVar62._8_4_ = uVar112;
  auVar62._12_4_ = uVar112;
  auVar47 = vshufps_avx(local_290,local_290,0x55);
  auVar56 = vshufps_avx(local_290,local_290,0xaa);
  aVar1 = pre->ray_space[k].vx.field_0;
  aVar2 = pre->ray_space[k].vy.field_0;
  fVar108 = pre->ray_space[k].vz.field_0.m128[0];
  fVar195 = pre->ray_space[k].vz.field_0.m128[1];
  fVar208 = pre->ray_space[k].vz.field_0.m128[2];
  fVar209 = pre->ray_space[k].vz.field_0.m128[3];
  auVar48._0_4_ = fVar108 * auVar56._0_4_;
  auVar48._4_4_ = fVar195 * auVar56._4_4_;
  auVar48._8_4_ = fVar208 * auVar56._8_4_;
  auVar48._12_4_ = fVar209 * auVar56._12_4_;
  auVar47 = vfmadd231ps_fma(auVar48,(undefined1  [16])aVar2,auVar47);
  auVar59 = vfmadd231ps_fma(auVar47,(undefined1  [16])aVar1,auVar62);
  local_2a0 = vsubps_avx512vl(local_350,auVar58);
  uVar112 = local_2a0._0_4_;
  auVar63._4_4_ = uVar112;
  auVar63._0_4_ = uVar112;
  auVar63._8_4_ = uVar112;
  auVar63._12_4_ = uVar112;
  auVar47 = vshufps_avx(local_2a0,local_2a0,0x55);
  auVar56 = vshufps_avx(local_2a0,local_2a0,0xaa);
  auVar73._0_4_ = fVar108 * auVar56._0_4_;
  auVar73._4_4_ = fVar195 * auVar56._4_4_;
  auVar73._8_4_ = fVar208 * auVar56._8_4_;
  auVar73._12_4_ = fVar209 * auVar56._12_4_;
  auVar47 = vfmadd231ps_fma(auVar73,(undefined1  [16])aVar2,auVar47);
  auVar61 = vfmadd231ps_fma(auVar47,(undefined1  [16])aVar1,auVar63);
  local_2b0 = vsubps_avx512vl(local_360,auVar58);
  uVar112 = local_2b0._0_4_;
  auVar66._4_4_ = uVar112;
  auVar66._0_4_ = uVar112;
  auVar66._8_4_ = uVar112;
  auVar66._12_4_ = uVar112;
  auVar47 = vshufps_avx(local_2b0,local_2b0,0x55);
  auVar56 = vshufps_avx(local_2b0,local_2b0,0xaa);
  auVar70._0_4_ = fVar108 * auVar56._0_4_;
  auVar70._4_4_ = fVar195 * auVar56._4_4_;
  auVar70._8_4_ = fVar208 * auVar56._8_4_;
  auVar70._12_4_ = fVar209 * auVar56._12_4_;
  auVar47 = vfmadd231ps_fma(auVar70,(undefined1  [16])aVar2,auVar47);
  auVar49 = vfmadd231ps_fma(auVar47,(undefined1  [16])aVar1,auVar66);
  local_2c0 = vsubps_avx(local_330,auVar58);
  uVar112 = local_2c0._0_4_;
  auVar173._4_4_ = uVar112;
  auVar173._0_4_ = uVar112;
  auVar173._8_4_ = uVar112;
  auVar173._12_4_ = uVar112;
  auVar47 = vshufps_avx(local_2c0,local_2c0,0x55);
  auVar56 = vshufps_avx(local_2c0,local_2c0,0xaa);
  auVar156._0_4_ = fVar108 * auVar56._0_4_;
  auVar156._4_4_ = fVar195 * auVar56._4_4_;
  auVar156._8_4_ = fVar208 * auVar56._8_4_;
  auVar156._12_4_ = fVar209 * auVar56._12_4_;
  auVar47 = vfmadd231ps_fma(auVar156,(undefined1  [16])aVar2,auVar47);
  auVar48 = vfmadd231ps_fma(auVar47,(undefined1  [16])aVar1,auVar173);
  local_2d0 = vsubps_avx(_local_320,auVar58);
  uVar112 = local_2d0._0_4_;
  auVar174._4_4_ = uVar112;
  auVar174._0_4_ = uVar112;
  auVar174._8_4_ = uVar112;
  auVar174._12_4_ = uVar112;
  auVar47 = vshufps_avx(local_2d0,local_2d0,0x55);
  auVar56 = vshufps_avx(local_2d0,local_2d0,0xaa);
  auVar199._0_4_ = auVar56._0_4_ * fVar108;
  auVar199._4_4_ = auVar56._4_4_ * fVar195;
  auVar199._8_4_ = auVar56._8_4_ * fVar208;
  auVar199._12_4_ = auVar56._12_4_ * fVar209;
  auVar47 = vfmadd231ps_fma(auVar199,(undefined1  [16])aVar2,auVar47);
  auVar50 = vfmadd231ps_fma(auVar47,(undefined1  [16])aVar1,auVar174);
  local_2e0 = vsubps_avx512vl(_local_370,auVar58);
  uVar112 = local_2e0._0_4_;
  auVar175._4_4_ = uVar112;
  auVar175._0_4_ = uVar112;
  auVar175._8_4_ = uVar112;
  auVar175._12_4_ = uVar112;
  auVar47 = vshufps_avx(local_2e0,local_2e0,0x55);
  auVar56 = vshufps_avx(local_2e0,local_2e0,0xaa);
  auVar212._0_4_ = auVar56._0_4_ * fVar108;
  auVar212._4_4_ = auVar56._4_4_ * fVar195;
  auVar212._8_4_ = auVar56._8_4_ * fVar208;
  auVar212._12_4_ = auVar56._12_4_ * fVar209;
  auVar47 = vfmadd231ps_fma(auVar212,(undefined1  [16])aVar2,auVar47);
  auVar51 = vfmadd231ps_fma(auVar47,(undefined1  [16])aVar1,auVar175);
  local_2f0 = vsubps_avx512vl(_local_380,auVar58);
  uVar112 = local_2f0._0_4_;
  auVar176._4_4_ = uVar112;
  auVar176._0_4_ = uVar112;
  auVar176._8_4_ = uVar112;
  auVar176._12_4_ = uVar112;
  auVar47 = vshufps_avx(local_2f0,local_2f0,0x55);
  auVar56 = vshufps_avx(local_2f0,local_2f0,0xaa);
  auVar220._0_4_ = auVar56._0_4_ * fVar108;
  auVar220._4_4_ = auVar56._4_4_ * fVar195;
  auVar220._8_4_ = auVar56._8_4_ * fVar208;
  auVar220._12_4_ = auVar56._12_4_ * fVar209;
  auVar47 = vfmadd231ps_fma(auVar220,(undefined1  [16])aVar2,auVar47);
  auVar52 = vfmadd231ps_fma(auVar47,(undefined1  [16])aVar1,auVar176);
  local_300 = vsubps_avx512vl(_local_340,auVar58);
  uVar112 = local_300._0_4_;
  auVar54._4_4_ = uVar112;
  auVar54._0_4_ = uVar112;
  auVar54._8_4_ = uVar112;
  auVar54._12_4_ = uVar112;
  auVar47 = vshufps_avx(local_300,local_300,0x55);
  auVar56 = vshufps_avx(local_300,local_300,0xaa);
  auVar72._0_4_ = auVar56._0_4_ * fVar108;
  auVar72._4_4_ = auVar56._4_4_ * fVar195;
  auVar72._8_4_ = auVar56._8_4_ * fVar208;
  auVar72._12_4_ = auVar56._12_4_ * fVar209;
  auVar47 = vfmadd231ps_fma(auVar72,(undefined1  [16])aVar2,auVar47);
  auVar54 = vfmadd231ps_fma(auVar47,(undefined1  [16])aVar1,auVar54);
  auVar3 = vmovlhps_avx(auVar59,auVar50);
  auVar57 = vmovlhps_avx(auVar61,auVar51);
  auVar53 = vmovlhps_avx512f(auVar49,auVar52);
  _local_420 = vmovlhps_avx512f(auVar48,auVar54);
  auVar56 = vminps_avx(auVar3,auVar57);
  auVar47 = vmaxps_avx(auVar3,auVar57);
  auVar58 = vminps_avx512vl(auVar53,_local_420);
  auVar56 = vminps_avx(auVar56,auVar58);
  auVar58 = vmaxps_avx512vl(auVar53,_local_420);
  auVar47 = vmaxps_avx(auVar47,auVar58);
  auVar58 = vshufpd_avx(auVar56,auVar56,3);
  auVar56 = vminps_avx(auVar56,auVar58);
  auVar58 = vshufpd_avx(auVar47,auVar47,3);
  auVar47 = vmaxps_avx(auVar47,auVar58);
  auVar56 = vandps_avx512vl(auVar56,auVar249._0_16_);
  auVar47 = vandps_avx512vl(auVar47,auVar249._0_16_);
  auVar47 = vmaxps_avx(auVar56,auVar47);
  auVar56 = vmovshdup_avx(auVar47);
  auVar47 = vmaxss_avx(auVar56,auVar47);
  local_400 = vmovddup_avx512vl(auVar59);
  local_410 = vmovddup_avx512vl(auVar61);
  auVar113._8_8_ = auVar49._0_8_;
  auVar113._0_8_ = auVar49._0_8_;
  auVar157._0_8_ = auVar48._0_8_;
  auVar157._8_8_ = auVar157._0_8_;
  local_430 = ZEXT416((uint)(auVar47._0_4_ * 9.536743e-07));
  local_1c0 = vbroadcastss_avx512vl(local_430);
  auVar47 = vxorps_avx512vl(local_1c0._0_16_,auVar250._0_16_);
  local_1e0 = vbroadcastss_avx512vl(auVar47);
  uVar39 = 0;
  auVar47 = vsubps_avx(auVar57,auVar3);
  auVar58 = vsubps_avx512vl(auVar53,auVar57);
  auVar59 = vsubps_avx512vl(_local_420,auVar53);
  local_390 = vsubps_avx(_local_320,local_310);
  local_3a0 = vsubps_avx512vl(_local_370,local_350);
  local_3b0 = vsubps_avx512vl(_local_380,local_360);
  _local_3c0 = vsubps_avx512vl(_local_340,local_330);
  local_220 = vpbroadcastd_avx512vl();
  local_240 = vpbroadcastd_avx512vl();
  auVar56 = ZEXT816(0x3f80000000000000);
  auVar246 = ZEXT1664(auVar56);
  do {
    auVar63 = auVar246._0_16_;
    auVar61 = vshufps_avx(auVar63,auVar63,0x50);
    auVar80 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
    auVar49 = vsubps_avx512vl(auVar80._0_16_,auVar61);
    fVar108 = auVar61._0_4_;
    fVar110 = auVar50._0_4_;
    auVar133._0_4_ = fVar110 * fVar108;
    fVar195 = auVar61._4_4_;
    fVar111 = auVar50._4_4_;
    auVar133._4_4_ = fVar111 * fVar195;
    fVar208 = auVar61._8_4_;
    auVar133._8_4_ = fVar110 * fVar208;
    fVar209 = auVar61._12_4_;
    auVar133._12_4_ = fVar111 * fVar209;
    fVar122 = auVar51._0_4_;
    auVar143._0_4_ = fVar122 * fVar108;
    fVar123 = auVar51._4_4_;
    auVar143._4_4_ = fVar123 * fVar195;
    auVar143._8_4_ = fVar122 * fVar208;
    auVar143._12_4_ = fVar123 * fVar209;
    fVar124 = auVar52._0_4_;
    auVar150._0_4_ = fVar124 * fVar108;
    fVar218 = auVar52._4_4_;
    auVar150._4_4_ = fVar218 * fVar195;
    auVar150._8_4_ = fVar124 * fVar208;
    auVar150._12_4_ = fVar218 * fVar209;
    fVar228 = auVar54._0_4_;
    auVar114._0_4_ = fVar228 * fVar108;
    fVar229 = auVar54._4_4_;
    auVar114._4_4_ = fVar229 * fVar195;
    auVar114._8_4_ = fVar228 * fVar208;
    auVar114._12_4_ = fVar229 * fVar209;
    auVar48 = vfmadd231ps_avx512vl(auVar133,auVar49,local_400);
    auVar55 = vfmadd231ps_avx512vl(auVar143,auVar49,local_410);
    auVar60 = vfmadd231ps_avx512vl(auVar150,auVar49,auVar113);
    auVar49 = vfmadd231ps_fma(auVar114,auVar157,auVar49);
    auVar61 = vmovshdup_avx(auVar56);
    fVar195 = auVar56._0_4_;
    fVar108 = (auVar61._0_4_ - fVar195) * 0.04761905;
    auVar171._4_4_ = fVar195;
    auVar171._0_4_ = fVar195;
    auVar171._8_4_ = fVar195;
    auVar171._12_4_ = fVar195;
    auVar171._16_4_ = fVar195;
    auVar171._20_4_ = fVar195;
    auVar171._24_4_ = fVar195;
    auVar171._28_4_ = fVar195;
    auVar128._0_8_ = auVar61._0_8_;
    auVar128._8_8_ = auVar128._0_8_;
    auVar128._16_8_ = auVar128._0_8_;
    auVar128._24_8_ = auVar128._0_8_;
    auVar79 = vsubps_avx(auVar128,auVar171);
    uVar112 = auVar48._0_4_;
    auVar129._4_4_ = uVar112;
    auVar129._0_4_ = uVar112;
    auVar129._8_4_ = uVar112;
    auVar129._12_4_ = uVar112;
    auVar129._16_4_ = uVar112;
    auVar129._20_4_ = uVar112;
    auVar129._24_4_ = uVar112;
    auVar129._28_4_ = uVar112;
    auVar192._8_4_ = 1;
    auVar192._0_8_ = 0x100000001;
    auVar192._12_4_ = 1;
    auVar192._16_4_ = 1;
    auVar192._20_4_ = 1;
    auVar192._24_4_ = 1;
    auVar192._28_4_ = 1;
    auVar90 = ZEXT1632(auVar48);
    auVar77 = vpermps_avx2(auVar192,auVar90);
    auVar78 = vbroadcastss_avx512vl(auVar55);
    auVar91 = ZEXT1632(auVar55);
    auVar81 = vpermps_avx512vl(auVar192,auVar91);
    auVar82 = vbroadcastss_avx512vl(auVar60);
    auVar87 = ZEXT1632(auVar60);
    auVar83 = vpermps_avx512vl(auVar192,auVar87);
    auVar84 = vbroadcastss_avx512vl(auVar49);
    auVar88 = ZEXT1632(auVar49);
    auVar76 = vpermps_avx512vl(auVar192,auVar88);
    auVar193._4_4_ = fVar108;
    auVar193._0_4_ = fVar108;
    auVar193._8_4_ = fVar108;
    auVar193._12_4_ = fVar108;
    auVar193._16_4_ = fVar108;
    auVar193._20_4_ = fVar108;
    auVar193._24_4_ = fVar108;
    auVar193._28_4_ = fVar108;
    auVar89 = auVar253._0_32_;
    auVar85 = vpermps_avx512vl(auVar89,auVar90);
    auVar161._8_4_ = 3;
    auVar161._0_8_ = 0x300000003;
    auVar161._12_4_ = 3;
    auVar161._16_4_ = 3;
    auVar161._20_4_ = 3;
    auVar161._24_4_ = 3;
    auVar161._28_4_ = 3;
    auVar86 = vpermps_avx512vl(auVar161,auVar90);
    auVar74 = vpermps_avx512vl(auVar89,auVar91);
    auVar90 = vpermps_avx2(auVar161,auVar91);
    auVar75 = vpermps_avx512vl(auVar89,auVar87);
    auVar91 = vpermps_avx2(auVar161,auVar87);
    auVar87 = vpermps_avx512vl(auVar89,auVar88);
    auVar88 = vpermps_avx512vl(auVar161,auVar88);
    auVar61 = vfmadd132ps_fma(auVar79,auVar171,_DAT_02020f20);
    auVar80 = vsubps_avx512vl(auVar80,ZEXT1632(auVar61));
    auVar79 = vmulps_avx512vl(auVar78,ZEXT1632(auVar61));
    auVar92 = ZEXT1632(auVar61);
    auVar89 = vmulps_avx512vl(auVar81,auVar92);
    auVar49 = vfmadd231ps_fma(auVar79,auVar80,auVar129);
    auVar48 = vfmadd231ps_fma(auVar89,auVar80,auVar77);
    auVar79 = vmulps_avx512vl(auVar82,auVar92);
    auVar89 = vmulps_avx512vl(auVar83,auVar92);
    auVar79 = vfmadd231ps_avx512vl(auVar79,auVar80,auVar78);
    auVar78 = vfmadd231ps_avx512vl(auVar89,auVar80,auVar81);
    auVar81 = vmulps_avx512vl(auVar84,auVar92);
    auVar89 = ZEXT1632(auVar61);
    auVar76 = vmulps_avx512vl(auVar76,auVar89);
    auVar81 = vfmadd231ps_avx512vl(auVar81,auVar80,auVar82);
    auVar82 = vfmadd231ps_avx512vl(auVar76,auVar80,auVar83);
    fVar208 = auVar61._0_4_;
    fVar209 = auVar61._4_4_;
    auVar23._4_4_ = fVar209 * auVar79._4_4_;
    auVar23._0_4_ = fVar208 * auVar79._0_4_;
    fVar210 = auVar61._8_4_;
    auVar23._8_4_ = fVar210 * auVar79._8_4_;
    fVar131 = auVar61._12_4_;
    auVar23._12_4_ = fVar131 * auVar79._12_4_;
    auVar23._16_4_ = auVar79._16_4_ * 0.0;
    auVar23._20_4_ = auVar79._20_4_ * 0.0;
    auVar23._24_4_ = auVar79._24_4_ * 0.0;
    auVar23._28_4_ = fVar195;
    auVar24._4_4_ = fVar209 * auVar78._4_4_;
    auVar24._0_4_ = fVar208 * auVar78._0_4_;
    auVar24._8_4_ = fVar210 * auVar78._8_4_;
    auVar24._12_4_ = fVar131 * auVar78._12_4_;
    auVar24._16_4_ = auVar78._16_4_ * 0.0;
    auVar24._20_4_ = auVar78._20_4_ * 0.0;
    auVar24._24_4_ = auVar78._24_4_ * 0.0;
    auVar24._28_4_ = auVar77._28_4_;
    auVar49 = vfmadd231ps_fma(auVar23,auVar80,ZEXT1632(auVar49));
    auVar48 = vfmadd231ps_fma(auVar24,auVar80,ZEXT1632(auVar48));
    auVar120._0_4_ = fVar208 * auVar81._0_4_;
    auVar120._4_4_ = fVar209 * auVar81._4_4_;
    auVar120._8_4_ = fVar210 * auVar81._8_4_;
    auVar120._12_4_ = fVar131 * auVar81._12_4_;
    auVar120._16_4_ = auVar81._16_4_ * 0.0;
    auVar120._20_4_ = auVar81._20_4_ * 0.0;
    auVar120._24_4_ = auVar81._24_4_ * 0.0;
    auVar120._28_4_ = 0;
    auVar25._4_4_ = fVar209 * auVar82._4_4_;
    auVar25._0_4_ = fVar208 * auVar82._0_4_;
    auVar25._8_4_ = fVar210 * auVar82._8_4_;
    auVar25._12_4_ = fVar131 * auVar82._12_4_;
    auVar25._16_4_ = auVar82._16_4_ * 0.0;
    auVar25._20_4_ = auVar82._20_4_ * 0.0;
    auVar25._24_4_ = auVar82._24_4_ * 0.0;
    auVar25._28_4_ = auVar81._28_4_;
    auVar55 = vfmadd231ps_fma(auVar120,auVar80,auVar79);
    auVar60 = vfmadd231ps_fma(auVar25,auVar80,auVar78);
    auVar26._28_4_ = auVar78._28_4_;
    auVar26._0_28_ =
         ZEXT1628(CONCAT412(fVar131 * auVar60._12_4_,
                            CONCAT48(fVar210 * auVar60._8_4_,
                                     CONCAT44(fVar209 * auVar60._4_4_,fVar208 * auVar60._0_4_))));
    auVar62 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar131 * auVar55._12_4_,
                                                 CONCAT48(fVar210 * auVar55._8_4_,
                                                          CONCAT44(fVar209 * auVar55._4_4_,
                                                                   fVar208 * auVar55._0_4_)))),
                              auVar80,ZEXT1632(auVar49));
    auVar73 = vfmadd231ps_fma(auVar26,auVar80,ZEXT1632(auVar48));
    auVar79 = vsubps_avx(ZEXT1632(auVar55),ZEXT1632(auVar49));
    auVar77 = vsubps_avx(ZEXT1632(auVar60),ZEXT1632(auVar48));
    auVar78 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
    auVar79 = vmulps_avx512vl(auVar79,auVar78);
    auVar77 = vmulps_avx512vl(auVar77,auVar78);
    auVar186._0_4_ = fVar108 * auVar79._0_4_;
    auVar186._4_4_ = fVar108 * auVar79._4_4_;
    auVar186._8_4_ = fVar108 * auVar79._8_4_;
    auVar186._12_4_ = fVar108 * auVar79._12_4_;
    auVar186._16_4_ = fVar108 * auVar79._16_4_;
    auVar186._20_4_ = fVar108 * auVar79._20_4_;
    auVar186._24_4_ = fVar108 * auVar79._24_4_;
    auVar186._28_4_ = 0;
    auVar79 = vmulps_avx512vl(auVar193,auVar77);
    auVar55 = vxorps_avx512vl(auVar84._0_16_,auVar84._0_16_);
    auVar81 = vpermt2ps_avx512vl(ZEXT1632(auVar62),_DAT_0205fd20,ZEXT1632(auVar55));
    auVar82 = vpermt2ps_avx512vl(ZEXT1632(auVar73),_DAT_0205fd20,ZEXT1632(auVar55));
    auVar121._0_4_ = auVar186._0_4_ + auVar62._0_4_;
    auVar121._4_4_ = auVar186._4_4_ + auVar62._4_4_;
    auVar121._8_4_ = auVar186._8_4_ + auVar62._8_4_;
    auVar121._12_4_ = auVar186._12_4_ + auVar62._12_4_;
    auVar121._16_4_ = auVar186._16_4_ + 0.0;
    auVar121._20_4_ = auVar186._20_4_ + 0.0;
    auVar121._24_4_ = auVar186._24_4_ + 0.0;
    auVar121._28_4_ = 0;
    auVar92 = ZEXT1632(auVar55);
    auVar77 = vpermt2ps_avx512vl(auVar186,_DAT_0205fd20,auVar92);
    auVar83 = vaddps_avx512vl(ZEXT1632(auVar73),auVar79);
    auVar84 = vpermt2ps_avx512vl(auVar79,_DAT_0205fd20,auVar92);
    auVar79 = vsubps_avx(auVar81,auVar77);
    auVar84 = vsubps_avx512vl(auVar82,auVar84);
    auVar77 = vmulps_avx512vl(auVar74,auVar89);
    auVar76 = vmulps_avx512vl(auVar90,auVar89);
    auVar77 = vfmadd231ps_avx512vl(auVar77,auVar80,auVar85);
    auVar76 = vfmadd231ps_avx512vl(auVar76,auVar80,auVar86);
    auVar85 = vmulps_avx512vl(auVar75,auVar89);
    auVar86 = vmulps_avx512vl(auVar91,auVar89);
    auVar85 = vfmadd231ps_avx512vl(auVar85,auVar80,auVar74);
    auVar90 = vfmadd231ps_avx512vl(auVar86,auVar80,auVar90);
    auVar86 = vmulps_avx512vl(auVar87,auVar89);
    auVar74 = vmulps_avx512vl(auVar88,auVar89);
    auVar49 = vfmadd231ps_fma(auVar86,auVar80,auVar75);
    auVar48 = vfmadd231ps_fma(auVar74,auVar80,auVar91);
    auVar86 = vmulps_avx512vl(auVar89,auVar85);
    auVar74 = vmulps_avx512vl(ZEXT1632(auVar61),auVar90);
    auVar77 = vfmadd231ps_avx512vl(auVar86,auVar80,auVar77);
    auVar76 = vfmadd231ps_avx512vl(auVar74,auVar80,auVar76);
    auVar85 = vfmadd231ps_avx512vl
                        (ZEXT1632(CONCAT412(fVar131 * auVar49._12_4_,
                                            CONCAT48(fVar210 * auVar49._8_4_,
                                                     CONCAT44(fVar209 * auVar49._4_4_,
                                                              fVar208 * auVar49._0_4_)))),auVar80,
                         auVar85);
    auVar90 = vfmadd231ps_avx512vl
                        (ZEXT1632(CONCAT412(fVar131 * auVar48._12_4_,
                                            CONCAT48(fVar210 * auVar48._8_4_,
                                                     CONCAT44(fVar209 * auVar48._4_4_,
                                                              fVar208 * auVar48._0_4_)))),auVar80,
                         auVar90);
    auVar27._4_4_ = fVar209 * auVar85._4_4_;
    auVar27._0_4_ = fVar208 * auVar85._0_4_;
    auVar27._8_4_ = fVar210 * auVar85._8_4_;
    auVar27._12_4_ = fVar131 * auVar85._12_4_;
    auVar27._16_4_ = auVar85._16_4_ * 0.0;
    auVar27._20_4_ = auVar85._20_4_ * 0.0;
    auVar27._24_4_ = auVar85._24_4_ * 0.0;
    auVar27._28_4_ = auVar91._28_4_;
    auVar28._4_4_ = fVar209 * auVar90._4_4_;
    auVar28._0_4_ = fVar208 * auVar90._0_4_;
    auVar28._8_4_ = fVar210 * auVar90._8_4_;
    auVar28._12_4_ = fVar131 * auVar90._12_4_;
    auVar28._16_4_ = auVar90._16_4_ * 0.0;
    auVar28._20_4_ = auVar90._20_4_ * 0.0;
    auVar28._24_4_ = auVar90._24_4_ * 0.0;
    auVar28._28_4_ = auVar75._28_4_;
    auVar91 = vfmadd231ps_avx512vl(auVar27,auVar80,auVar77);
    auVar80 = vfmadd231ps_avx512vl(auVar28,auVar76,auVar80);
    auVar77 = vsubps_avx512vl(auVar85,auVar77);
    auVar90 = vsubps_avx512vl(auVar90,auVar76);
    auVar77 = vmulps_avx512vl(auVar77,auVar78);
    auVar90 = vmulps_avx512vl(auVar90,auVar78);
    fVar195 = fVar108 * auVar77._0_4_;
    fVar208 = fVar108 * auVar77._4_4_;
    auVar29._4_4_ = fVar208;
    auVar29._0_4_ = fVar195;
    fVar209 = fVar108 * auVar77._8_4_;
    auVar29._8_4_ = fVar209;
    fVar210 = fVar108 * auVar77._12_4_;
    auVar29._12_4_ = fVar210;
    fVar131 = fVar108 * auVar77._16_4_;
    auVar29._16_4_ = fVar131;
    fVar211 = fVar108 * auVar77._20_4_;
    auVar29._20_4_ = fVar211;
    fVar108 = fVar108 * auVar77._24_4_;
    auVar29._24_4_ = fVar108;
    auVar29._28_4_ = auVar77._28_4_;
    auVar90 = vmulps_avx512vl(auVar193,auVar90);
    auVar78 = vpermt2ps_avx512vl(auVar91,_DAT_0205fd20,auVar92);
    auVar76 = vpermt2ps_avx512vl(auVar80,_DAT_0205fd20,auVar92);
    auVar194._0_4_ = auVar91._0_4_ + fVar195;
    auVar194._4_4_ = auVar91._4_4_ + fVar208;
    auVar194._8_4_ = auVar91._8_4_ + fVar209;
    auVar194._12_4_ = auVar91._12_4_ + fVar210;
    auVar194._16_4_ = auVar91._16_4_ + fVar131;
    auVar194._20_4_ = auVar91._20_4_ + fVar211;
    auVar194._24_4_ = auVar91._24_4_ + fVar108;
    auVar194._28_4_ = auVar91._28_4_ + auVar77._28_4_;
    auVar77 = vpermt2ps_avx512vl(auVar29,_DAT_0205fd20,ZEXT1632(auVar55));
    auVar85 = vaddps_avx512vl(auVar80,auVar90);
    auVar90 = vpermt2ps_avx512vl(auVar90,_DAT_0205fd20,ZEXT1632(auVar55));
    auVar77 = vsubps_avx(auVar78,auVar77);
    auVar90 = vsubps_avx512vl(auVar76,auVar90);
    auVar140 = ZEXT1632(auVar62);
    auVar86 = vsubps_avx512vl(auVar91,auVar140);
    auVar147 = ZEXT1632(auVar73);
    auVar74 = vsubps_avx512vl(auVar80,auVar147);
    auVar75 = vsubps_avx512vl(auVar78,auVar81);
    auVar86 = vaddps_avx512vl(auVar86,auVar75);
    auVar75 = vsubps_avx512vl(auVar76,auVar82);
    auVar74 = vaddps_avx512vl(auVar74,auVar75);
    auVar75 = vmulps_avx512vl(auVar147,auVar86);
    auVar75 = vfnmadd231ps_avx512vl(auVar75,auVar140,auVar74);
    auVar87 = vmulps_avx512vl(auVar83,auVar86);
    auVar87 = vfnmadd231ps_avx512vl(auVar87,auVar121,auVar74);
    auVar88 = vmulps_avx512vl(auVar84,auVar86);
    auVar88 = vfnmadd231ps_avx512vl(auVar88,auVar79,auVar74);
    auVar89 = vmulps_avx512vl(auVar82,auVar86);
    auVar89 = vfnmadd231ps_avx512vl(auVar89,auVar81,auVar74);
    auVar92 = vmulps_avx512vl(auVar80,auVar86);
    auVar92 = vfnmadd231ps_avx512vl(auVar92,auVar91,auVar74);
    auVar93 = vmulps_avx512vl(auVar85,auVar86);
    auVar93 = vfnmadd231ps_avx512vl(auVar93,auVar194,auVar74);
    auVar94 = vmulps_avx512vl(auVar90,auVar86);
    auVar94 = vfnmadd231ps_avx512vl(auVar94,auVar77,auVar74);
    auVar86 = vmulps_avx512vl(auVar76,auVar86);
    auVar86 = vfnmadd231ps_avx512vl(auVar86,auVar78,auVar74);
    auVar74 = vminps_avx512vl(auVar75,auVar87);
    auVar75 = vmaxps_avx512vl(auVar75,auVar87);
    auVar87 = vminps_avx512vl(auVar88,auVar89);
    auVar74 = vminps_avx512vl(auVar74,auVar87);
    auVar87 = vmaxps_avx512vl(auVar88,auVar89);
    auVar75 = vmaxps_avx512vl(auVar75,auVar87);
    auVar87 = vminps_avx512vl(auVar92,auVar93);
    auVar88 = vmaxps_avx512vl(auVar92,auVar93);
    auVar89 = vminps_avx512vl(auVar94,auVar86);
    auVar87 = vminps_avx512vl(auVar87,auVar89);
    auVar74 = vminps_avx512vl(auVar74,auVar87);
    auVar86 = vmaxps_avx512vl(auVar94,auVar86);
    auVar86 = vmaxps_avx512vl(auVar88,auVar86);
    auVar86 = vmaxps_avx512vl(auVar75,auVar86);
    uVar19 = vcmpps_avx512vl(auVar74,local_1c0,2);
    uVar20 = vcmpps_avx512vl(auVar86,local_1e0,5);
    uVar41 = 0;
    bVar37 = (byte)uVar19 & (byte)uVar20 & 0x7f;
    if (bVar37 != 0) {
      auVar86 = vsubps_avx512vl(auVar81,auVar140);
      auVar74 = vsubps_avx512vl(auVar82,auVar147);
      auVar75 = vsubps_avx512vl(auVar78,auVar91);
      auVar86 = vaddps_avx512vl(auVar86,auVar75);
      auVar75 = vsubps_avx512vl(auVar76,auVar80);
      auVar74 = vaddps_avx512vl(auVar74,auVar75);
      auVar75 = vmulps_avx512vl(auVar147,auVar86);
      auVar75 = vfnmadd231ps_avx512vl(auVar75,auVar74,auVar140);
      auVar83 = vmulps_avx512vl(auVar83,auVar86);
      auVar83 = vfnmadd213ps_avx512vl(auVar121,auVar74,auVar83);
      auVar84 = vmulps_avx512vl(auVar84,auVar86);
      auVar84 = vfnmadd213ps_avx512vl(auVar79,auVar74,auVar84);
      auVar79 = vmulps_avx512vl(auVar82,auVar86);
      auVar81 = vfnmadd231ps_avx512vl(auVar79,auVar74,auVar81);
      auVar79 = vmulps_avx512vl(auVar80,auVar86);
      auVar80 = vfnmadd231ps_avx512vl(auVar79,auVar74,auVar91);
      auVar79 = vmulps_avx512vl(auVar85,auVar86);
      auVar82 = vfnmadd213ps_avx512vl(auVar194,auVar74,auVar79);
      auVar79 = vmulps_avx512vl(auVar90,auVar86);
      auVar85 = vfnmadd213ps_avx512vl(auVar77,auVar74,auVar79);
      auVar79 = vmulps_avx512vl(auVar76,auVar86);
      auVar78 = vfnmadd231ps_avx512vl(auVar79,auVar78,auVar74);
      auVar77 = vminps_avx(auVar75,auVar83);
      auVar79 = vmaxps_avx(auVar75,auVar83);
      auVar90 = vminps_avx(auVar84,auVar81);
      auVar90 = vminps_avx(auVar77,auVar90);
      auVar77 = vmaxps_avx(auVar84,auVar81);
      auVar79 = vmaxps_avx(auVar79,auVar77);
      auVar91 = vminps_avx(auVar80,auVar82);
      auVar77 = vmaxps_avx(auVar80,auVar82);
      auVar80 = vminps_avx(auVar85,auVar78);
      auVar91 = vminps_avx(auVar91,auVar80);
      auVar91 = vminps_avx(auVar90,auVar91);
      auVar90 = vmaxps_avx(auVar85,auVar78);
      auVar77 = vmaxps_avx(auVar77,auVar90);
      auVar79 = vmaxps_avx(auVar79,auVar77);
      uVar19 = vcmpps_avx512vl(auVar79,local_1e0,5);
      uVar20 = vcmpps_avx512vl(auVar91,local_1c0,2);
      uVar41 = (uint)(bVar37 & (byte)uVar19 & (byte)uVar20);
    }
    if (uVar41 != 0) {
      auStack_3f0[uVar39] = uVar41;
      uVar19 = vmovlps_avx(auVar56);
      *(undefined8 *)(&uStack_280 + uVar39 * 2) = uVar19;
      uVar43 = vmovlps_avx512f(auVar63);
      auStack_1a0[uVar39] = uVar43;
      uVar39 = (ulong)((int)uVar39 + 1);
    }
    auVar56 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
    auVar247 = ZEXT1664(auVar56);
    auVar56 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
    auVar249 = ZEXT1664(auVar56);
    auVar56 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
    auVar250 = ZEXT1664(auVar56);
    auVar79 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
    auVar248 = ZEXT3264(auVar79);
    auVar251 = ZEXT464(0x3f800000);
    auVar56 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
    auVar252 = ZEXT1664(auVar56);
    do {
      if ((int)uVar39 == 0) {
        uVar112 = *(undefined4 *)(ray + k * 4 + 0x100);
        auVar22._4_4_ = uVar112;
        auVar22._0_4_ = uVar112;
        auVar22._8_4_ = uVar112;
        auVar22._12_4_ = uVar112;
        auVar22._16_4_ = uVar112;
        auVar22._20_4_ = uVar112;
        auVar22._24_4_ = uVar112;
        auVar22._28_4_ = uVar112;
        uVar19 = vcmpps_avx512vl(local_200,auVar22,2);
        uVar46 = (uint)uVar45 & (uint)uVar45 + 0xff & (uint)uVar19;
        uVar45 = (ulong)uVar46;
        if (uVar46 == 0) {
          return;
        }
        goto LAB_01d9c186;
      }
      uVar38 = (int)uVar39 - 1;
      uVar40 = (ulong)uVar38;
      uVar41 = (&uStack_280)[uVar40 * 2];
      fVar108 = afStack_27c[uVar40 * 2];
      uVar6 = auStack_3f0[uVar40];
      auVar244._8_8_ = 0;
      auVar244._0_8_ = auStack_1a0[uVar40];
      auVar246 = ZEXT1664(auVar244);
      lVar44 = 0;
      for (uVar43 = (ulong)uVar6; (uVar43 & 1) == 0; uVar43 = uVar43 >> 1 | 0x8000000000000000) {
        lVar44 = lVar44 + 1;
      }
      uVar42 = uVar6 - 1 & uVar6;
      auStack_3f0[uVar40] = uVar42;
      if (uVar42 == 0) {
        uVar39 = (ulong)uVar38;
      }
      auVar125._0_4_ = (float)lVar44;
      auVar125._4_8_ = SUB128(ZEXT812(0),4);
      auVar125._12_4_ = 0;
      auVar56 = vmulss_avx512f(auVar125,SUB6416(ZEXT464(0x3e124925),0));
      lVar44 = lVar44 + 1;
      auVar61 = vmulss_avx512f(ZEXT416((uint)(float)lVar44),SUB6416(ZEXT464(0x3e124925),0));
      auVar48 = auVar251._0_16_;
      auVar49 = vsubss_avx512f(auVar48,auVar56);
      auVar56 = vmulss_avx512f(ZEXT416((uint)fVar108),auVar56);
      auVar49 = vfmadd231ss_avx512f(auVar56,ZEXT416(uVar41),auVar49);
      auVar56 = vsubss_avx512f(auVar48,auVar61);
      auVar56 = vfmadd231ss_fma(ZEXT416((uint)(fVar108 * auVar61._0_4_)),ZEXT416(uVar41),auVar56);
      auVar61 = vsubss_avx512f(auVar56,auVar49);
      vucomiss_avx512f(auVar61);
      if (uVar6 == 0 || lVar44 == 0) break;
      auVar55 = vshufps_avx(auVar244,auVar244,0x50);
      vucomiss_avx512f(auVar61);
      auVar172 = auVar252._0_16_;
      auVar62 = vsubps_avx512vl(auVar172,auVar55);
      fVar108 = auVar55._0_4_;
      auVar134._0_4_ = fVar110 * fVar108;
      fVar195 = auVar55._4_4_;
      auVar134._4_4_ = fVar111 * fVar195;
      fVar208 = auVar55._8_4_;
      auVar134._8_4_ = fVar110 * fVar208;
      fVar209 = auVar55._12_4_;
      auVar134._12_4_ = fVar111 * fVar209;
      auVar144._0_4_ = fVar122 * fVar108;
      auVar144._4_4_ = fVar123 * fVar195;
      auVar144._8_4_ = fVar122 * fVar208;
      auVar144._12_4_ = fVar123 * fVar209;
      auVar151._0_4_ = fVar124 * fVar108;
      auVar151._4_4_ = fVar218 * fVar195;
      auVar151._8_4_ = fVar124 * fVar208;
      auVar151._12_4_ = fVar218 * fVar209;
      auVar115._0_4_ = fVar228 * fVar108;
      auVar115._4_4_ = fVar229 * fVar195;
      auVar115._8_4_ = fVar228 * fVar208;
      auVar115._12_4_ = fVar229 * fVar209;
      auVar55 = vfmadd231ps_fma(auVar134,auVar62,local_400);
      auVar60 = vfmadd231ps_fma(auVar144,auVar62,local_410);
      auVar63 = vfmadd231ps_avx512vl(auVar151,auVar62,auVar113);
      auVar62 = vfmadd231ps_fma(auVar115,auVar157,auVar62);
      auVar130._16_16_ = auVar55;
      auVar130._0_16_ = auVar55;
      auVar141._16_16_ = auVar60;
      auVar141._0_16_ = auVar60;
      auVar148._16_16_ = auVar63;
      auVar148._0_16_ = auVar63;
      uVar112 = auVar49._0_4_;
      auVar162._4_4_ = uVar112;
      auVar162._0_4_ = uVar112;
      auVar162._8_4_ = uVar112;
      auVar162._12_4_ = uVar112;
      uVar112 = auVar56._0_4_;
      auVar162._20_4_ = uVar112;
      auVar162._16_4_ = uVar112;
      auVar162._24_4_ = uVar112;
      auVar162._28_4_ = uVar112;
      auVar79 = vsubps_avx(auVar141,auVar130);
      auVar60 = vfmadd213ps_fma(auVar79,auVar162,auVar130);
      auVar79 = vsubps_avx(auVar148,auVar141);
      auVar73 = vfmadd213ps_fma(auVar79,auVar162,auVar141);
      auVar55 = vsubps_avx(auVar62,auVar63);
      auVar142._16_16_ = auVar55;
      auVar142._0_16_ = auVar55;
      auVar55 = vfmadd213ps_fma(auVar142,auVar162,auVar148);
      auVar79 = vsubps_avx(ZEXT1632(auVar73),ZEXT1632(auVar60));
      auVar60 = vfmadd213ps_fma(auVar79,auVar162,ZEXT1632(auVar60));
      auVar79 = vsubps_avx(ZEXT1632(auVar55),ZEXT1632(auVar73));
      auVar55 = vfmadd213ps_fma(auVar79,auVar162,ZEXT1632(auVar73));
      auVar79 = vsubps_avx(ZEXT1632(auVar55),ZEXT1632(auVar60));
      auVar68 = vfmadd231ps_fma(ZEXT1632(auVar60),auVar79,auVar162);
      auVar79 = vmulps_avx512vl(auVar79,auVar248._0_32_);
      auVar72 = auVar79._16_16_;
      fVar108 = auVar61._0_4_ * 0.33333334;
      auVar152._0_8_ =
           CONCAT44(auVar68._4_4_ + fVar108 * auVar79._4_4_,auVar68._0_4_ + fVar108 * auVar79._0_4_)
      ;
      auVar152._8_4_ = auVar68._8_4_ + fVar108 * auVar79._8_4_;
      auVar152._12_4_ = auVar68._12_4_ + fVar108 * auVar79._12_4_;
      auVar135._0_4_ = fVar108 * auVar79._16_4_;
      auVar135._4_4_ = fVar108 * auVar79._20_4_;
      auVar135._8_4_ = fVar108 * auVar79._24_4_;
      auVar135._12_4_ = fVar108 * auVar79._28_4_;
      auVar156 = vsubps_avx((undefined1  [16])0x0,auVar135);
      auVar71 = vshufpd_avx(auVar68,auVar68,3);
      auVar69 = vshufpd_avx((undefined1  [16])0x0,(undefined1  [16])0x0,3);
      auVar55 = vsubps_avx(auVar71,auVar68);
      auVar60 = vsubps_avx(auVar69,(undefined1  [16])0x0);
      auVar163._0_4_ = auVar60._0_4_ + auVar55._0_4_;
      auVar163._4_4_ = auVar60._4_4_ + auVar55._4_4_;
      auVar163._8_4_ = auVar60._8_4_ + auVar55._8_4_;
      auVar163._12_4_ = auVar60._12_4_ + auVar55._12_4_;
      auVar55 = vshufps_avx(auVar68,auVar68,0xb1);
      auVar60 = vshufps_avx(auVar152,auVar152,0xb1);
      auVar62 = vshufps_avx(auVar156,auVar156,0xb1);
      auVar73 = vshufps_avx((undefined1  [16])0x0,(undefined1  [16])0x0,0xb1);
      auVar221._4_4_ = auVar163._0_4_;
      auVar221._0_4_ = auVar163._0_4_;
      auVar221._8_4_ = auVar163._0_4_;
      auVar221._12_4_ = auVar163._0_4_;
      auVar63 = vshufps_avx(auVar163,auVar163,0x55);
      fVar108 = auVar63._0_4_;
      auVar177._0_4_ = auVar55._0_4_ * fVar108;
      fVar195 = auVar63._4_4_;
      auVar177._4_4_ = auVar55._4_4_ * fVar195;
      fVar208 = auVar63._8_4_;
      auVar177._8_4_ = auVar55._8_4_ * fVar208;
      fVar209 = auVar63._12_4_;
      auVar177._12_4_ = auVar55._12_4_ * fVar209;
      auVar190._0_4_ = auVar60._0_4_ * fVar108;
      auVar190._4_4_ = auVar60._4_4_ * fVar195;
      auVar190._8_4_ = auVar60._8_4_ * fVar208;
      auVar190._12_4_ = auVar60._12_4_ * fVar209;
      auVar200._0_4_ = auVar62._0_4_ * fVar108;
      auVar200._4_4_ = auVar62._4_4_ * fVar195;
      auVar200._8_4_ = auVar62._8_4_ * fVar208;
      auVar200._12_4_ = auVar62._12_4_ * fVar209;
      auVar164._0_4_ = auVar73._0_4_ * fVar108;
      auVar164._4_4_ = auVar73._4_4_ * fVar195;
      auVar164._8_4_ = auVar73._8_4_ * fVar208;
      auVar164._12_4_ = auVar73._12_4_ * fVar209;
      auVar55 = vfmadd231ps_fma(auVar177,auVar221,auVar68);
      auVar60 = vfmadd231ps_fma(auVar190,auVar221,auVar152);
      auVar63 = vfmadd231ps_fma(auVar200,auVar221,auVar156);
      auVar67 = vfmadd231ps_fma(auVar164,(undefined1  [16])0x0,auVar221);
      auVar70 = vshufpd_avx(auVar55,auVar55,1);
      auVar64 = vshufpd_avx(auVar60,auVar60,1);
      auVar65 = vshufpd_avx(auVar63,auVar63,1);
      auVar66 = vshufpd_avx(auVar67,auVar67,1);
      auVar62 = vminss_avx(auVar55,auVar60);
      auVar55 = vmaxss_avx(auVar60,auVar55);
      auVar73 = vminss_avx(auVar63,auVar67);
      auVar60 = vmaxss_avx(auVar67,auVar63);
      auVar73 = vminss_avx(auVar62,auVar73);
      auVar55 = vmaxss_avx(auVar60,auVar55);
      auVar63 = vminss_avx(auVar70,auVar64);
      auVar60 = vmaxss_avx(auVar64,auVar70);
      auVar70 = vminss_avx(auVar65,auVar66);
      auVar62 = vmaxss_avx(auVar66,auVar65);
      auVar63 = vminss_avx(auVar63,auVar70);
      auVar60 = vmaxss_avx(auVar62,auVar60);
      fVar208 = auVar73._0_4_;
      fVar195 = auVar60._0_4_;
      fVar108 = auVar55._0_4_;
      if ((0.0001 <= fVar208) || (fVar195 <= -0.0001)) {
        uVar19 = vcmpps_avx512vl(auVar63,SUB6416(ZEXT464(0x38d1b717),0),1);
        uVar20 = vcmpps_avx512vl(auVar73,SUB6416(ZEXT464(0x38d1b717),0),1);
        if ((-0.0001 < fVar108 & ((byte)uVar20 | (byte)uVar19)) != 0) goto LAB_01d9d074;
        uVar19 = vcmpps_avx512vl(SUB6416(ZEXT464(0xb8d1b717),0),auVar60,5);
        uVar20 = vcmpps_avx512vl(auVar63,SUB6416(ZEXT464(0x38d1b717),0),5);
        if ((((ushort)uVar20 | (ushort)uVar19) & 1) == 0) goto LAB_01d9d074;
        bVar11 = true;
        auVar246 = ZEXT1664(auVar244);
      }
      else {
LAB_01d9d074:
        auVar64 = auVar255._0_16_;
        uVar19 = vcmpss_avx512f(auVar73,auVar64,1);
        bVar11 = (bool)((byte)uVar19 & 1);
        iVar107 = auVar251._0_4_;
        fVar209 = (float)((uint)bVar11 * -0x40800000 + (uint)!bVar11 * iVar107);
        uVar19 = vcmpss_avx512f(auVar55,auVar64,1);
        bVar11 = (bool)((byte)uVar19 & 1);
        fVar210 = (float)((uint)bVar11 * -0x40800000 + (uint)!bVar11 * iVar107);
        bVar11 = fVar209 != fVar210;
        iVar254 = auVar255._0_4_;
        auVar96._16_16_ = auVar72;
        auVar96._0_16_ = SUB6416(ZEXT464(0x7f800000),0);
        auVar95._4_28_ = auVar96._4_28_;
        auVar95._0_4_ = (uint)bVar11 * iVar254 + (uint)!bVar11 * 0x7f800000;
        auVar70 = auVar95._0_16_;
        auVar98._16_16_ = auVar72;
        auVar98._0_16_ = SUB6416(ZEXT464(0xff800000),0);
        auVar97._4_28_ = auVar98._4_28_;
        auVar97._0_4_ = (uint)bVar11 * iVar254 + (uint)!bVar11 * -0x800000;
        auVar62 = auVar97._0_16_;
        uVar19 = vcmpss_avx512f(auVar63,auVar64,1);
        bVar11 = (bool)((byte)uVar19 & 1);
        fVar131 = (float)((uint)bVar11 * -0x40800000 + (uint)!bVar11 * iVar107);
        if ((fVar209 != fVar131) || (NAN(fVar209) || NAN(fVar131))) {
          fVar209 = auVar63._0_4_;
          bVar11 = fVar209 == fVar208;
          if ((!bVar11) || (NAN(fVar209) || NAN(fVar208))) {
            auVar73 = vxorps_avx512vl(auVar73,auVar250._0_16_);
            auVar239._0_4_ = auVar73._0_4_ / (fVar209 - fVar208);
            auVar239._4_12_ = auVar73._4_12_;
            auVar73 = vsubss_avx512f(auVar48,auVar239);
            auVar63 = vfmadd213ss_avx512f(auVar73,auVar64,auVar239);
            auVar73 = auVar63;
          }
          else {
            vucomiss_avx512f(auVar64);
            auVar100._16_16_ = auVar72;
            auVar100._0_16_ = SUB6416(ZEXT464(0x7f800000),0);
            auVar99._4_28_ = auVar100._4_28_;
            auVar99._0_4_ = (uint)bVar11 * iVar254 + (uint)!bVar11 * 0x7f800000;
            auVar63 = auVar99._0_16_;
            auVar73 = ZEXT416((uint)bVar11 * 0x3f800000 + (uint)!bVar11 * -0x800000);
          }
          auVar70 = vminss_avx(auVar70,auVar63);
          auVar62 = vmaxss_avx(auVar73,auVar62);
        }
        uVar19 = vcmpss_avx512f(auVar60,auVar64,1);
        bVar11 = (bool)((byte)uVar19 & 1);
        fVar208 = (float)((uint)bVar11 * -0x40800000 + (uint)!bVar11 * iVar107);
        if ((fVar210 != fVar208) || (NAN(fVar210) || NAN(fVar208))) {
          bVar11 = fVar195 == fVar108;
          if ((!bVar11) || (NAN(fVar195) || NAN(fVar108))) {
            auVar55 = vxorps_avx512vl(auVar55,auVar250._0_16_);
            auVar201._0_4_ = auVar55._0_4_ / (fVar195 - fVar108);
            auVar201._4_12_ = auVar55._4_12_;
            auVar55 = vsubss_avx512f(auVar48,auVar201);
            auVar60 = vfmadd213ss_avx512f(auVar55,auVar64,auVar201);
            auVar55 = auVar60;
          }
          else {
            vucomiss_avx512f(auVar64);
            auVar102._16_16_ = auVar72;
            auVar102._0_16_ = SUB6416(ZEXT464(0x7f800000),0);
            auVar101._4_28_ = auVar102._4_28_;
            auVar101._0_4_ = (uint)bVar11 * iVar254 + (uint)!bVar11 * 0x7f800000;
            auVar60 = auVar101._0_16_;
            auVar55 = ZEXT416((uint)bVar11 * 0x3f800000 + (uint)!bVar11 * -0x800000);
          }
          auVar70 = vminss_avx(auVar70,auVar60);
          auVar62 = vmaxss_avx(auVar55,auVar62);
        }
        bVar11 = fVar131 != fVar208;
        auVar55 = vminss_avx512f(auVar70,auVar48);
        auVar104._16_16_ = auVar72;
        auVar104._0_16_ = auVar70;
        auVar103._4_28_ = auVar104._4_28_;
        auVar103._0_4_ = (uint)bVar11 * auVar55._0_4_ + (uint)!bVar11 * auVar70._0_4_;
        auVar55 = vmaxss_avx512f(auVar48,auVar62);
        auVar106._16_16_ = auVar72;
        auVar106._0_16_ = auVar62;
        auVar105._4_28_ = auVar106._4_28_;
        auVar105._0_4_ = (uint)bVar11 * auVar55._0_4_ + (uint)!bVar11 * auVar62._0_4_;
        auVar55 = vmaxss_avx512f(auVar64,auVar103._0_16_);
        auVar60 = vminss_avx512f(auVar105._0_16_,auVar48);
        bVar11 = true;
        if (auVar55._0_4_ <= auVar60._0_4_) {
          auVar64 = vmaxss_avx512f(auVar64,ZEXT416((uint)(auVar55._0_4_ + -0.1)));
          auVar65 = vminss_avx512f(ZEXT416((uint)(auVar60._0_4_ + 0.1)),auVar48);
          auVar116._0_8_ = auVar68._0_8_;
          auVar116._8_8_ = auVar116._0_8_;
          auVar191._8_8_ = auVar152._0_8_;
          auVar191._0_8_ = auVar152._0_8_;
          auVar202._8_8_ = auVar156._0_8_;
          auVar202._0_8_ = auVar156._0_8_;
          auVar55 = vshufpd_avx(auVar152,auVar152,3);
          auVar60 = vshufpd_avx(auVar156,auVar156,3);
          auVar62 = vshufps_avx(auVar64,auVar65,0);
          auVar66 = vsubps_avx512vl(auVar172,auVar62);
          fVar108 = auVar62._0_4_;
          auVar233._0_4_ = fVar108 * auVar71._0_4_;
          fVar195 = auVar62._4_4_;
          auVar233._4_4_ = fVar195 * auVar71._4_4_;
          fVar208 = auVar62._8_4_;
          auVar233._8_4_ = fVar208 * auVar71._8_4_;
          fVar209 = auVar62._12_4_;
          auVar233._12_4_ = fVar209 * auVar71._12_4_;
          auVar153._0_4_ = fVar108 * auVar55._0_4_;
          auVar153._4_4_ = fVar195 * auVar55._4_4_;
          auVar153._8_4_ = fVar208 * auVar55._8_4_;
          auVar153._12_4_ = fVar209 * auVar55._12_4_;
          auVar158._0_4_ = fVar108 * auVar60._0_4_;
          auVar158._4_4_ = fVar195 * auVar60._4_4_;
          auVar158._8_4_ = fVar208 * auVar60._8_4_;
          auVar158._12_4_ = fVar209 * auVar60._12_4_;
          auVar136._0_4_ = fVar108 * auVar69._0_4_;
          auVar136._4_4_ = fVar195 * auVar69._4_4_;
          auVar136._8_4_ = fVar208 * auVar69._8_4_;
          auVar136._12_4_ = fVar209 * auVar69._12_4_;
          auVar73 = vfmadd231ps_fma(auVar233,auVar66,auVar116);
          auVar63 = vfmadd231ps_fma(auVar153,auVar66,auVar191);
          auVar70 = vfmadd231ps_fma(auVar158,auVar66,auVar202);
          auVar71 = vfmadd231ps_fma(auVar136,auVar66,ZEXT816(0));
          auVar55 = vsubss_avx512f(auVar48,auVar64);
          auVar60 = vmovshdup_avx512vl(auVar244);
          auVar67 = vfmadd231ss_avx512f(ZEXT416((uint)(auVar60._0_4_ * auVar64._0_4_)),auVar244,
                                        auVar55);
          auVar55 = vsubss_avx512f(auVar48,auVar65);
          auVar68 = vfmadd231ss_avx512f(ZEXT416((uint)(auVar65._0_4_ * auVar60._0_4_)),auVar244,
                                        auVar55);
          auVar69 = vdivss_avx512f(auVar48,auVar61);
          auVar61 = vsubps_avx(auVar63,auVar73);
          auVar173 = auVar247._0_16_;
          auVar60 = vmulps_avx512vl(auVar61,auVar173);
          auVar61 = vsubps_avx(auVar70,auVar63);
          auVar62 = vmulps_avx512vl(auVar61,auVar173);
          auVar61 = vsubps_avx(auVar71,auVar70);
          auVar61 = vmulps_avx512vl(auVar61,auVar173);
          auVar55 = vminps_avx(auVar62,auVar61);
          auVar61 = vmaxps_avx(auVar62,auVar61);
          auVar55 = vminps_avx(auVar60,auVar55);
          auVar61 = vmaxps_avx(auVar60,auVar61);
          auVar60 = vshufpd_avx(auVar55,auVar55,3);
          auVar62 = vshufpd_avx(auVar61,auVar61,3);
          auVar55 = vminps_avx(auVar55,auVar60);
          auVar61 = vmaxps_avx(auVar61,auVar62);
          fVar108 = auVar69._0_4_;
          auVar178._0_4_ = fVar108 * auVar55._0_4_;
          auVar178._4_4_ = fVar108 * auVar55._4_4_;
          auVar178._8_4_ = fVar108 * auVar55._8_4_;
          auVar178._12_4_ = fVar108 * auVar55._12_4_;
          auVar165._0_4_ = fVar108 * auVar61._0_4_;
          auVar165._4_4_ = fVar108 * auVar61._4_4_;
          auVar165._8_4_ = fVar108 * auVar61._8_4_;
          auVar165._12_4_ = fVar108 * auVar61._12_4_;
          auVar69 = vdivss_avx512f(auVar48,ZEXT416((uint)(auVar68._0_4_ - auVar67._0_4_)));
          auVar61 = vshufpd_avx(auVar73,auVar73,3);
          auVar55 = vshufpd_avx(auVar63,auVar63,3);
          auVar60 = vshufpd_avx(auVar70,auVar70,3);
          auVar62 = vshufpd_avx(auVar71,auVar71,3);
          auVar61 = vsubps_avx(auVar61,auVar73);
          auVar73 = vsubps_avx(auVar55,auVar63);
          auVar63 = vsubps_avx(auVar60,auVar70);
          auVar62 = vsubps_avx(auVar62,auVar71);
          auVar55 = vminps_avx(auVar61,auVar73);
          auVar61 = vmaxps_avx(auVar61,auVar73);
          auVar60 = vminps_avx(auVar63,auVar62);
          auVar60 = vminps_avx(auVar55,auVar60);
          auVar55 = vmaxps_avx(auVar63,auVar62);
          auVar61 = vmaxps_avx(auVar61,auVar55);
          fVar108 = auVar69._0_4_;
          auVar203._0_4_ = fVar108 * auVar60._0_4_;
          auVar203._4_4_ = fVar108 * auVar60._4_4_;
          auVar203._8_4_ = fVar108 * auVar60._8_4_;
          auVar203._12_4_ = fVar108 * auVar60._12_4_;
          auVar213._0_4_ = fVar108 * auVar61._0_4_;
          auVar213._4_4_ = fVar108 * auVar61._4_4_;
          auVar213._8_4_ = fVar108 * auVar61._8_4_;
          auVar213._12_4_ = fVar108 * auVar61._12_4_;
          auVar156 = vinsertps_avx512f(auVar49,auVar67,0x10);
          auVar73 = vinsertps_avx(auVar56,auVar68,0x10);
          auVar109._0_4_ = auVar156._0_4_ + auVar73._0_4_;
          auVar109._4_4_ = auVar156._4_4_ + auVar73._4_4_;
          auVar109._8_4_ = auVar156._8_4_ + auVar73._8_4_;
          auVar109._12_4_ = auVar156._12_4_ + auVar73._12_4_;
          auVar21._8_4_ = 0x3f000000;
          auVar21._0_8_ = 0x3f0000003f000000;
          auVar21._12_4_ = 0x3f000000;
          auVar65 = vmulps_avx512vl(auVar109,auVar21);
          auVar60 = vshufps_avx(auVar65,auVar65,0x54);
          uVar112 = auVar65._0_4_;
          auVar126._4_4_ = uVar112;
          auVar126._0_4_ = uVar112;
          auVar126._8_4_ = uVar112;
          auVar126._12_4_ = uVar112;
          auVar55 = vfmadd213ps_fma(auVar47,auVar126,auVar3);
          auVar63 = vfmadd213ps_avx512vl(auVar58,auVar126,auVar57);
          auVar62 = vfmadd213ps_fma(auVar59,auVar126,auVar53);
          auVar61 = vsubps_avx(auVar63,auVar55);
          auVar55 = vfmadd213ps_fma(auVar61,auVar126,auVar55);
          auVar61 = vsubps_avx(auVar62,auVar63);
          auVar61 = vfmadd213ps_fma(auVar61,auVar126,auVar63);
          auVar61 = vsubps_avx(auVar61,auVar55);
          auVar55 = vfmadd231ps_fma(auVar55,auVar61,auVar126);
          auVar70 = vmulps_avx512vl(auVar61,auVar173);
          auVar222._8_8_ = auVar55._0_8_;
          auVar222._0_8_ = auVar55._0_8_;
          auVar61 = vshufpd_avx(auVar55,auVar55,3);
          auVar55 = vshufps_avx(auVar65,auVar65,0x55);
          auVar62 = vsubps_avx(auVar61,auVar222);
          auVar63 = vfmadd231ps_fma(auVar222,auVar55,auVar62);
          auVar240._8_8_ = auVar70._0_8_;
          auVar240._0_8_ = auVar70._0_8_;
          auVar61 = vshufpd_avx(auVar70,auVar70,3);
          auVar61 = vsubps_avx(auVar61,auVar240);
          auVar55 = vfmadd213ps_fma(auVar61,auVar55,auVar240);
          auVar127._0_8_ = auVar62._0_8_ ^ 0x8000000080000000;
          auVar127._8_4_ = auVar62._8_4_ ^ 0x80000000;
          auVar127._12_4_ = auVar62._12_4_ ^ 0x80000000;
          auVar61 = vmovshdup_avx(auVar55);
          auVar241._0_8_ = auVar61._0_8_ ^ 0x8000000080000000;
          auVar241._8_4_ = auVar61._8_4_ ^ 0x80000000;
          auVar241._12_4_ = auVar61._12_4_ ^ 0x80000000;
          auVar70 = vmovshdup_avx512vl(auVar62);
          auVar71 = vpermt2ps_avx512vl(auVar241,ZEXT416(5),auVar62);
          auVar61 = vfmsub231ss_avx512f(ZEXT416((uint)(auVar61._0_4_ * auVar62._0_4_)),auVar55,
                                        auVar70);
          auVar55 = vpermt2ps_avx512vl(auVar55,SUB6416(ZEXT464(4),0),auVar127);
          auVar137._0_4_ = auVar61._0_4_;
          auVar137._4_4_ = auVar137._0_4_;
          auVar137._8_4_ = auVar137._0_4_;
          auVar137._12_4_ = auVar137._0_4_;
          auVar61 = vdivps_avx(auVar71,auVar137);
          auVar55 = vdivps_avx(auVar55,auVar137);
          fVar195 = auVar63._0_4_;
          auVar62 = vshufps_avx(auVar63,auVar63,0x55);
          fVar108 = auVar55._0_4_;
          auVar223._0_4_ = fVar195 * auVar61._0_4_ + auVar62._0_4_ * fVar108;
          auVar223._4_4_ = fVar195 * auVar61._4_4_ + auVar62._4_4_ * auVar55._4_4_;
          auVar223._8_4_ = fVar195 * auVar61._8_4_ + auVar62._8_4_ * auVar55._8_4_;
          auVar223._12_4_ = fVar195 * auVar61._12_4_ + auVar62._12_4_ * auVar55._12_4_;
          auVar66 = vsubps_avx(auVar60,auVar223);
          auVar63 = vmovshdup_avx(auVar61);
          auVar60 = vinsertps_avx(auVar178,auVar203,0x1c);
          auVar242._0_4_ = auVar63._0_4_ * auVar60._0_4_;
          auVar242._4_4_ = auVar63._4_4_ * auVar60._4_4_;
          auVar242._8_4_ = auVar63._8_4_ * auVar60._8_4_;
          auVar242._12_4_ = auVar63._12_4_ * auVar60._12_4_;
          auVar62 = vinsertps_avx(auVar165,auVar213,0x1c);
          auVar224._0_4_ = auVar63._0_4_ * auVar62._0_4_;
          auVar224._4_4_ = auVar63._4_4_ * auVar62._4_4_;
          auVar224._8_4_ = auVar63._8_4_ * auVar62._8_4_;
          auVar224._12_4_ = auVar63._12_4_ * auVar62._12_4_;
          auVar64 = vminps_avx512vl(auVar242,auVar224);
          auVar71 = vmaxps_avx(auVar224,auVar242);
          auVar69 = vmovshdup_avx(auVar55);
          auVar63 = vinsertps_avx(auVar203,auVar178,0x4c);
          auVar204._0_4_ = auVar69._0_4_ * auVar63._0_4_;
          auVar204._4_4_ = auVar69._4_4_ * auVar63._4_4_;
          auVar204._8_4_ = auVar69._8_4_ * auVar63._8_4_;
          auVar204._12_4_ = auVar69._12_4_ * auVar63._12_4_;
          auVar70 = vinsertps_avx(auVar213,auVar165,0x4c);
          auVar214._0_4_ = auVar69._0_4_ * auVar70._0_4_;
          auVar214._4_4_ = auVar69._4_4_ * auVar70._4_4_;
          auVar214._8_4_ = auVar69._8_4_ * auVar70._8_4_;
          auVar214._12_4_ = auVar69._12_4_ * auVar70._12_4_;
          auVar69 = vminps_avx(auVar204,auVar214);
          auVar64 = vaddps_avx512vl(auVar64,auVar69);
          auVar69 = vmaxps_avx(auVar214,auVar204);
          auVar205._0_4_ = auVar71._0_4_ + auVar69._0_4_;
          auVar205._4_4_ = auVar71._4_4_ + auVar69._4_4_;
          auVar205._8_4_ = auVar71._8_4_ + auVar69._8_4_;
          auVar205._12_4_ = auVar71._12_4_ + auVar69._12_4_;
          auVar215._8_8_ = 0x3f80000000000000;
          auVar215._0_8_ = 0x3f80000000000000;
          auVar71 = vsubps_avx(auVar215,auVar205);
          auVar69 = vsubps_avx(auVar215,auVar64);
          auVar64 = vsubps_avx(auVar156,auVar65);
          auVar65 = vsubps_avx(auVar73,auVar65);
          fVar131 = auVar64._0_4_;
          auVar243._0_4_ = fVar131 * auVar71._0_4_;
          fVar211 = auVar64._4_4_;
          auVar243._4_4_ = fVar211 * auVar71._4_4_;
          fVar230 = auVar64._8_4_;
          auVar243._8_4_ = fVar230 * auVar71._8_4_;
          fVar231 = auVar64._12_4_;
          auVar243._12_4_ = fVar231 * auVar71._12_4_;
          auVar72 = vbroadcastss_avx512vl(auVar61);
          auVar60 = vmulps_avx512vl(auVar72,auVar60);
          auVar62 = vmulps_avx512vl(auVar72,auVar62);
          auVar72 = vminps_avx512vl(auVar60,auVar62);
          auVar60 = vmaxps_avx(auVar62,auVar60);
          auVar179._0_4_ = fVar108 * auVar63._0_4_;
          auVar179._4_4_ = fVar108 * auVar63._4_4_;
          auVar179._8_4_ = fVar108 * auVar63._8_4_;
          auVar179._12_4_ = fVar108 * auVar63._12_4_;
          auVar166._0_4_ = fVar108 * auVar70._0_4_;
          auVar166._4_4_ = fVar108 * auVar70._4_4_;
          auVar166._8_4_ = fVar108 * auVar70._8_4_;
          auVar166._12_4_ = fVar108 * auVar70._12_4_;
          auVar62 = vminps_avx(auVar179,auVar166);
          auVar63 = vaddps_avx512vl(auVar72,auVar62);
          auVar70 = vmulps_avx512vl(auVar64,auVar69);
          fVar195 = auVar65._0_4_;
          auVar206._0_4_ = fVar195 * auVar71._0_4_;
          fVar208 = auVar65._4_4_;
          auVar206._4_4_ = fVar208 * auVar71._4_4_;
          fVar209 = auVar65._8_4_;
          auVar206._8_4_ = fVar209 * auVar71._8_4_;
          fVar210 = auVar65._12_4_;
          auVar206._12_4_ = fVar210 * auVar71._12_4_;
          auVar216._0_4_ = fVar195 * auVar69._0_4_;
          auVar216._4_4_ = fVar208 * auVar69._4_4_;
          auVar216._8_4_ = fVar209 * auVar69._8_4_;
          auVar216._12_4_ = fVar210 * auVar69._12_4_;
          auVar62 = vmaxps_avx(auVar166,auVar179);
          auVar167._0_4_ = auVar60._0_4_ + auVar62._0_4_;
          auVar167._4_4_ = auVar60._4_4_ + auVar62._4_4_;
          auVar167._8_4_ = auVar60._8_4_ + auVar62._8_4_;
          auVar167._12_4_ = auVar60._12_4_ + auVar62._12_4_;
          auVar180._8_8_ = 0x3f800000;
          auVar180._0_8_ = 0x3f800000;
          auVar60 = vsubps_avx(auVar180,auVar167);
          auVar62 = vsubps_avx(auVar180,auVar63);
          auVar234._0_4_ = fVar131 * auVar60._0_4_;
          auVar234._4_4_ = fVar211 * auVar60._4_4_;
          auVar234._8_4_ = fVar230 * auVar60._8_4_;
          auVar234._12_4_ = fVar231 * auVar60._12_4_;
          auVar225._0_4_ = fVar131 * auVar62._0_4_;
          auVar225._4_4_ = fVar211 * auVar62._4_4_;
          auVar225._8_4_ = fVar230 * auVar62._8_4_;
          auVar225._12_4_ = fVar231 * auVar62._12_4_;
          auVar168._0_4_ = fVar195 * auVar60._0_4_;
          auVar168._4_4_ = fVar208 * auVar60._4_4_;
          auVar168._8_4_ = fVar209 * auVar60._8_4_;
          auVar168._12_4_ = fVar210 * auVar60._12_4_;
          auVar181._0_4_ = fVar195 * auVar62._0_4_;
          auVar181._4_4_ = fVar208 * auVar62._4_4_;
          auVar181._8_4_ = fVar209 * auVar62._8_4_;
          auVar181._12_4_ = fVar210 * auVar62._12_4_;
          auVar60 = vminps_avx(auVar234,auVar225);
          auVar62 = vminps_avx(auVar168,auVar181);
          auVar63 = vminps_avx(auVar60,auVar62);
          auVar60 = vmaxps_avx(auVar225,auVar234);
          auVar62 = vmaxps_avx(auVar181,auVar168);
          auVar62 = vmaxps_avx(auVar62,auVar60);
          auVar71 = vminps_avx512vl(auVar243,auVar70);
          auVar60 = vminps_avx(auVar206,auVar216);
          auVar60 = vminps_avx(auVar71,auVar60);
          auVar60 = vhaddps_avx(auVar63,auVar60);
          auVar70 = vmaxps_avx512vl(auVar70,auVar243);
          auVar63 = vmaxps_avx(auVar216,auVar206);
          auVar63 = vmaxps_avx(auVar63,auVar70);
          auVar62 = vhaddps_avx(auVar62,auVar63);
          auVar60 = vshufps_avx(auVar60,auVar60,0xe8);
          auVar62 = vshufps_avx(auVar62,auVar62,0xe8);
          auVar169._0_4_ = auVar60._0_4_ + auVar66._0_4_;
          auVar169._4_4_ = auVar60._4_4_ + auVar66._4_4_;
          auVar169._8_4_ = auVar60._8_4_ + auVar66._8_4_;
          auVar169._12_4_ = auVar60._12_4_ + auVar66._12_4_;
          auVar182._0_4_ = auVar62._0_4_ + auVar66._0_4_;
          auVar182._4_4_ = auVar62._4_4_ + auVar66._4_4_;
          auVar182._8_4_ = auVar62._8_4_ + auVar66._8_4_;
          auVar182._12_4_ = auVar62._12_4_ + auVar66._12_4_;
          auVar60 = vmaxps_avx(auVar156,auVar169);
          auVar62 = vminps_avx(auVar182,auVar73);
          uVar43 = vcmpps_avx512vl(auVar62,auVar60,1);
          local_440 = vinsertps_avx(auVar67,auVar68,0x10);
          auVar246 = ZEXT1664(local_440);
          auVar60 = ZEXT416(5);
          if ((uVar43 & 3) == 0) {
            vucomiss_avx512f(auVar49);
            auVar60 = vxorps_avx512vl(auVar60,auVar60);
            auVar255 = ZEXT1664(auVar60);
            if ((uint)uVar39 < 4 && (uVar6 == 0 || lVar44 == 0)) {
              bVar11 = false;
            }
            else {
              lVar44 = 200;
              do {
                auVar62 = vsubss_avx512f(auVar48,auVar66);
                fVar209 = auVar62._0_4_;
                fVar195 = fVar209 * fVar209 * fVar209;
                fVar210 = auVar66._0_4_;
                fVar208 = fVar210 * 3.0 * fVar209 * fVar209;
                fVar209 = fVar209 * fVar210 * fVar210 * 3.0;
                auVar154._4_4_ = fVar195;
                auVar154._0_4_ = fVar195;
                auVar154._8_4_ = fVar195;
                auVar154._12_4_ = fVar195;
                auVar145._4_4_ = fVar208;
                auVar145._0_4_ = fVar208;
                auVar145._8_4_ = fVar208;
                auVar145._12_4_ = fVar208;
                auVar117._4_4_ = fVar209;
                auVar117._0_4_ = fVar209;
                auVar117._8_4_ = fVar209;
                auVar117._12_4_ = fVar209;
                fVar210 = fVar210 * fVar210 * fVar210;
                auVar159._0_4_ = (float)local_420._0_4_ * fVar210;
                auVar159._4_4_ = (float)local_420._4_4_ * fVar210;
                auVar159._8_4_ = fStack_418 * fVar210;
                auVar159._12_4_ = fStack_414 * fVar210;
                auVar62 = vfmadd231ps_fma(auVar159,auVar53,auVar117);
                auVar62 = vfmadd231ps_fma(auVar62,auVar57,auVar145);
                auVar62 = vfmadd231ps_fma(auVar62,auVar3,auVar154);
                auVar118._8_8_ = auVar62._0_8_;
                auVar118._0_8_ = auVar62._0_8_;
                auVar62 = vshufpd_avx(auVar62,auVar62,3);
                auVar73 = vshufps_avx(auVar66,auVar66,0x55);
                auVar62 = vsubps_avx(auVar62,auVar118);
                auVar73 = vfmadd213ps_fma(auVar62,auVar73,auVar118);
                fVar195 = auVar73._0_4_;
                auVar62 = vshufps_avx(auVar73,auVar73,0x55);
                auVar119._0_4_ = auVar61._0_4_ * fVar195 + fVar108 * auVar62._0_4_;
                auVar119._4_4_ = auVar61._4_4_ * fVar195 + auVar55._4_4_ * auVar62._4_4_;
                auVar119._8_4_ = auVar61._8_4_ * fVar195 + auVar55._8_4_ * auVar62._8_4_;
                auVar119._12_4_ = auVar61._12_4_ * fVar195 + auVar55._12_4_ * auVar62._12_4_;
                auVar66 = vsubps_avx(auVar66,auVar119);
                auVar62 = vandps_avx512vl(auVar73,auVar249._0_16_);
                auVar73 = vprolq_avx512vl(auVar62,0x20);
                auVar62 = vmaxss_avx(auVar73,auVar62);
                bVar18 = auVar62._0_4_ <= (float)local_430._0_4_;
                if (auVar62._0_4_ < (float)local_430._0_4_) {
                  auVar61 = vucomiss_avx512f(auVar60);
                  if (bVar18) {
                    auVar48 = vucomiss_avx512f(auVar61);
                    auVar251 = ZEXT1664(auVar48);
                    if (bVar18) {
                      vmovshdup_avx(auVar61);
                      auVar48 = vucomiss_avx512f(auVar60);
                      if (bVar18) {
                        auVar55 = vucomiss_avx512f(auVar48);
                        auVar251 = ZEXT1664(auVar55);
                        if (bVar18) {
                          auVar62 = vinsertps_avx(ZEXT416((uint)pre->ray_space[k].vx.field_0.m128[2]
                                                         ),ZEXT416((uint)pre->ray_space[k].vy.
                                                                         field_0.m128[2]),0x1c);
                          auVar65 = vinsertps_avx(auVar62,ZEXT416((uint)pre->ray_space[k].vz.field_0
                                                                        .m128[2]),0x28);
                          auVar62 = vdpps_avx(auVar65,local_290,0x7f);
                          auVar73 = vdpps_avx(auVar65,local_2a0,0x7f);
                          auVar63 = vdpps_avx(auVar65,local_2b0,0x7f);
                          auVar70 = vdpps_avx(auVar65,local_2c0,0x7f);
                          auVar71 = vdpps_avx(auVar65,local_2d0,0x7f);
                          auVar69 = vdpps_avx(auVar65,local_2e0,0x7f);
                          auVar64 = vdpps_avx(auVar65,local_2f0,0x7f);
                          auVar65 = vdpps_avx(auVar65,local_300,0x7f);
                          auVar66 = vsubss_avx512f(auVar55,auVar48);
                          fVar209 = auVar48._0_4_;
                          auVar48 = vfmadd231ss_fma(ZEXT416((uint)(fVar209 * auVar71._0_4_)),auVar66
                                                    ,auVar62);
                          auVar62 = vfmadd231ss_fma(ZEXT416((uint)(auVar69._0_4_ * fVar209)),auVar66
                                                    ,auVar73);
                          auVar73 = vfmadd231ss_fma(ZEXT416((uint)(auVar64._0_4_ * fVar209)),auVar66
                                                    ,auVar63);
                          auVar63 = vfmadd231ss_fma(ZEXT416((uint)(fVar209 * auVar65._0_4_)),auVar66
                                                    ,auVar70);
                          auVar55 = vsubss_avx512f(auVar55,auVar61);
                          auVar170._0_4_ = auVar55._0_4_;
                          fVar108 = auVar170._0_4_ * auVar170._0_4_ * auVar170._0_4_;
                          local_120 = auVar61._0_4_;
                          fVar195 = local_120 * 3.0 * auVar170._0_4_ * auVar170._0_4_;
                          fVar208 = auVar170._0_4_ * local_120 * local_120 * 3.0;
                          fVar131 = local_120 * local_120 * local_120;
                          auVar55 = vfmadd231ss_fma(ZEXT416((uint)(fVar131 * auVar63._0_4_)),
                                                    ZEXT416((uint)fVar208),auVar73);
                          auVar55 = vfmadd231ss_fma(auVar55,ZEXT416((uint)fVar195),auVar62);
                          auVar48 = vfmadd231ss_fma(auVar55,ZEXT416((uint)fVar108),auVar48);
                          fVar210 = auVar48._0_4_;
                          if ((fVar132 <= fVar210) &&
                             (fVar211 = *(float *)(ray + k * 4 + 0x100), fVar210 <= fVar211)) {
                            auVar48 = vshufps_avx(auVar61,auVar61,0x55);
                            auVar73 = vsubps_avx512vl(auVar172,auVar48);
                            fVar230 = auVar48._0_4_;
                            auVar207._0_4_ = fVar230 * (float)local_320._0_4_;
                            fVar231 = auVar48._4_4_;
                            auVar207._4_4_ = fVar231 * (float)local_320._4_4_;
                            fVar236 = auVar48._8_4_;
                            auVar207._8_4_ = fVar236 * fStack_318;
                            fVar237 = auVar48._12_4_;
                            auVar207._12_4_ = fVar237 * fStack_314;
                            auVar217._0_4_ = fVar230 * (float)local_370._0_4_;
                            auVar217._4_4_ = fVar231 * (float)local_370._4_4_;
                            auVar217._8_4_ = fVar236 * fStack_368;
                            auVar217._12_4_ = fVar237 * fStack_364;
                            auVar226._0_4_ = fVar230 * (float)local_380._0_4_;
                            auVar226._4_4_ = fVar231 * (float)local_380._4_4_;
                            auVar226._8_4_ = fVar236 * fStack_378;
                            auVar226._12_4_ = fVar237 * fStack_374;
                            auVar183._0_4_ = fVar230 * (float)local_340._0_4_;
                            auVar183._4_4_ = fVar231 * (float)local_340._4_4_;
                            auVar183._8_4_ = fVar236 * fStack_338;
                            auVar183._12_4_ = fVar237 * fStack_334;
                            auVar48 = vfmadd231ps_fma(auVar207,auVar73,local_310);
                            auVar55 = vfmadd231ps_fma(auVar217,auVar73,local_350);
                            auVar62 = vfmadd231ps_fma(auVar226,auVar73,local_360);
                            auVar73 = vfmadd231ps_fma(auVar183,auVar73,local_330);
                            auVar48 = vsubps_avx(auVar55,auVar48);
                            auVar55 = vsubps_avx(auVar62,auVar55);
                            auVar62 = vsubps_avx(auVar73,auVar62);
                            auVar227._0_4_ = local_120 * auVar55._0_4_;
                            auVar227._4_4_ = local_120 * auVar55._4_4_;
                            auVar227._8_4_ = local_120 * auVar55._8_4_;
                            auVar227._12_4_ = local_120 * auVar55._12_4_;
                            auVar170._4_4_ = auVar170._0_4_;
                            auVar170._8_4_ = auVar170._0_4_;
                            auVar170._12_4_ = auVar170._0_4_;
                            auVar48 = vfmadd231ps_fma(auVar227,auVar170,auVar48);
                            auVar184._0_4_ = local_120 * auVar62._0_4_;
                            auVar184._4_4_ = local_120 * auVar62._4_4_;
                            auVar184._8_4_ = local_120 * auVar62._8_4_;
                            auVar184._12_4_ = local_120 * auVar62._12_4_;
                            auVar55 = vfmadd231ps_fma(auVar184,auVar170,auVar55);
                            auVar185._0_4_ = local_120 * auVar55._0_4_;
                            auVar185._4_4_ = local_120 * auVar55._4_4_;
                            auVar185._8_4_ = local_120 * auVar55._8_4_;
                            auVar185._12_4_ = local_120 * auVar55._12_4_;
                            auVar48 = vfmadd231ps_fma(auVar185,auVar170,auVar48);
                            auVar48 = vmulps_avx512vl(auVar48,auVar173);
                            pGVar7 = (context->scene->geometries).items[uVar46].ptr;
                            if ((pGVar7->mask & *(uint *)(ray + k * 4 + 0x120)) != 0) {
                              auVar160._0_4_ = fVar131 * (float)local_3c0._0_4_;
                              auVar160._4_4_ = fVar131 * (float)local_3c0._4_4_;
                              auVar160._8_4_ = fVar131 * fStack_3b8;
                              auVar160._12_4_ = fVar131 * fStack_3b4;
                              auVar155._4_4_ = fVar208;
                              auVar155._0_4_ = fVar208;
                              auVar155._8_4_ = fVar208;
                              auVar155._12_4_ = fVar208;
                              auVar55 = vfmadd132ps_fma(auVar155,auVar160,local_3b0);
                              auVar146._4_4_ = fVar195;
                              auVar146._0_4_ = fVar195;
                              auVar146._8_4_ = fVar195;
                              auVar146._12_4_ = fVar195;
                              auVar55 = vfmadd132ps_fma(auVar146,auVar55,local_3a0);
                              auVar138._4_4_ = fVar108;
                              auVar138._0_4_ = fVar108;
                              auVar138._8_4_ = fVar108;
                              auVar138._12_4_ = fVar108;
                              auVar73 = vfmadd132ps_fma(auVar138,auVar55,local_390);
                              auVar55 = vshufps_avx(auVar73,auVar73,0xc9);
                              auVar62 = vshufps_avx(auVar48,auVar48,0xc9);
                              auVar139._0_4_ = auVar73._0_4_ * auVar62._0_4_;
                              auVar139._4_4_ = auVar73._4_4_ * auVar62._4_4_;
                              auVar139._8_4_ = auVar73._8_4_ * auVar62._8_4_;
                              auVar139._12_4_ = auVar73._12_4_ * auVar62._12_4_;
                              auVar48 = vfmsub231ps_fma(auVar139,auVar48,auVar55);
                              local_140 = auVar48._0_4_;
                              if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                                 (pGVar7->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                                *(float *)(ray + k * 4 + 0x100) = fVar210;
                                uVar112 = vextractps_avx(auVar48,1);
                                *(undefined4 *)(ray + k * 4 + 0x180) = uVar112;
                                uVar112 = vextractps_avx(auVar48,2);
                                *(undefined4 *)(ray + k * 4 + 0x1a0) = uVar112;
                                *(undefined4 *)(ray + k * 4 + 0x1c0) = local_140;
                                *(float *)(ray + k * 4 + 0x1e0) = local_120;
                                *(float *)(ray + k * 4 + 0x200) = fVar209;
                                *(uint *)(ray + k * 4 + 0x220) = uVar5;
                                *(uint *)(ray + k * 4 + 0x240) = uVar46;
                                *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
                                *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
                              }
                              else {
                                auVar149._8_4_ = 1;
                                auVar149._0_8_ = 0x100000001;
                                auVar149._12_4_ = 1;
                                auVar149._16_4_ = 1;
                                auVar149._20_4_ = 1;
                                auVar149._24_4_ = 1;
                                auVar149._28_4_ = 1;
                                local_100 = vpermps_avx2(auVar149,ZEXT1632(auVar61));
                                auVar79 = vpermps_avx2(auVar149,ZEXT1632(auVar48));
                                local_160 = vpermps_avx512vl(auVar253._0_32_,ZEXT1632(auVar48));
                                local_180[0] = (RTCHitN)auVar79[0];
                                local_180[1] = (RTCHitN)auVar79[1];
                                local_180[2] = (RTCHitN)auVar79[2];
                                local_180[3] = (RTCHitN)auVar79[3];
                                local_180[4] = (RTCHitN)auVar79[4];
                                local_180[5] = (RTCHitN)auVar79[5];
                                local_180[6] = (RTCHitN)auVar79[6];
                                local_180[7] = (RTCHitN)auVar79[7];
                                local_180[8] = (RTCHitN)auVar79[8];
                                local_180[9] = (RTCHitN)auVar79[9];
                                local_180[10] = (RTCHitN)auVar79[10];
                                local_180[0xb] = (RTCHitN)auVar79[0xb];
                                local_180[0xc] = (RTCHitN)auVar79[0xc];
                                local_180[0xd] = (RTCHitN)auVar79[0xd];
                                local_180[0xe] = (RTCHitN)auVar79[0xe];
                                local_180[0xf] = (RTCHitN)auVar79[0xf];
                                local_180[0x10] = (RTCHitN)auVar79[0x10];
                                local_180[0x11] = (RTCHitN)auVar79[0x11];
                                local_180[0x12] = (RTCHitN)auVar79[0x12];
                                local_180[0x13] = (RTCHitN)auVar79[0x13];
                                local_180[0x14] = (RTCHitN)auVar79[0x14];
                                local_180[0x15] = (RTCHitN)auVar79[0x15];
                                local_180[0x16] = (RTCHitN)auVar79[0x16];
                                local_180[0x17] = (RTCHitN)auVar79[0x17];
                                local_180[0x18] = (RTCHitN)auVar79[0x18];
                                local_180[0x19] = (RTCHitN)auVar79[0x19];
                                local_180[0x1a] = (RTCHitN)auVar79[0x1a];
                                local_180[0x1b] = (RTCHitN)auVar79[0x1b];
                                local_180[0x1c] = (RTCHitN)auVar79[0x1c];
                                local_180[0x1d] = (RTCHitN)auVar79[0x1d];
                                local_180[0x1e] = (RTCHitN)auVar79[0x1e];
                                local_180[0x1f] = (RTCHitN)auVar79[0x1f];
                                uStack_13c = local_140;
                                uStack_138 = local_140;
                                uStack_134 = local_140;
                                uStack_130 = local_140;
                                uStack_12c = local_140;
                                uStack_128 = local_140;
                                uStack_124 = local_140;
                                fStack_11c = local_120;
                                fStack_118 = local_120;
                                fStack_114 = local_120;
                                fStack_110 = local_120;
                                fStack_10c = local_120;
                                fStack_108 = local_120;
                                fStack_104 = local_120;
                                local_e0 = local_240._0_8_;
                                uStack_d8 = local_240._8_8_;
                                uStack_d0 = local_240._16_8_;
                                uStack_c8 = local_240._24_8_;
                                local_c0 = local_220;
                                vpcmpeqd_avx2(local_220,local_220);
                                uStack_9c = context->user->instID[0];
                                local_a0 = uStack_9c;
                                uStack_98 = uStack_9c;
                                uStack_94 = uStack_9c;
                                uStack_90 = uStack_9c;
                                uStack_8c = uStack_9c;
                                uStack_88 = uStack_9c;
                                uStack_84 = uStack_9c;
                                uStack_7c = context->user->instPrimID[0];
                                local_80 = uStack_7c;
                                uStack_78 = uStack_7c;
                                uStack_74 = uStack_7c;
                                uStack_70 = uStack_7c;
                                uStack_6c = uStack_7c;
                                uStack_68 = uStack_7c;
                                uStack_64 = uStack_7c;
                                *(float *)(ray + k * 4 + 0x100) = fVar210;
                                local_3e0 = local_260._0_8_;
                                uStack_3d8 = local_260._8_8_;
                                uStack_3d0 = local_260._16_8_;
                                uStack_3c8 = local_260._24_8_;
                                local_470.valid = (int *)&local_3e0;
                                local_470.geometryUserPtr = pGVar7->userPtr;
                                local_470.context = context->user;
                                local_470.hit = local_180;
                                local_470.N = 8;
                                local_470.ray = (RTCRayN *)ray;
                                if (pGVar7->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                                  (*pGVar7->intersectionFilterN)(&local_470);
                                  auVar246 = ZEXT1664(local_440);
                                  auVar61 = vxorps_avx512vl(auVar60,auVar60);
                                  auVar255 = ZEXT1664(auVar61);
                                  auVar251 = ZEXT464(0x3f800000);
                                  auVar79 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                                  auVar248 = ZEXT3264(auVar79);
                                  auVar61 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                                  auVar250 = ZEXT1664(auVar61);
                                  auVar61 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                                  auVar249 = ZEXT1664(auVar61);
                                  auVar79 = vbroadcastss_avx512vl(ZEXT416(2));
                                  auVar253 = ZEXT3264(auVar79);
                                }
                                auVar61 = auVar255._0_16_;
                                auVar35._8_8_ = uStack_3d8;
                                auVar35._0_8_ = local_3e0;
                                auVar35._16_8_ = uStack_3d0;
                                auVar35._24_8_ = uStack_3c8;
                                if (auVar35 == (undefined1  [32])0x0) {
LAB_01d9df19:
                                  *(float *)(ray + k * 4 + 0x100) = fVar211;
                                }
                                else {
                                  p_Var10 = context->args->filter;
                                  if ((p_Var10 != (RTCFilterFunctionN)0x0) &&
                                     (((context->args->flags &
                                       RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                                       RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                      (((pGVar7->field_8).field_0x2 & 0x40) != 0)))) {
                                    (*p_Var10)(&local_470);
                                    auVar246 = ZEXT1664(local_440);
                                    auVar61 = vxorps_avx512vl(auVar61,auVar61);
                                    auVar255 = ZEXT1664(auVar61);
                                    auVar251 = ZEXT464(0x3f800000);
                                    auVar79 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                                    auVar248 = ZEXT3264(auVar79);
                                    auVar61 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                                    auVar250 = ZEXT1664(auVar61);
                                    auVar61 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                                    auVar249 = ZEXT1664(auVar61);
                                    auVar79 = vbroadcastss_avx512vl(ZEXT416(2));
                                    auVar253 = ZEXT3264(auVar79);
                                  }
                                  auVar36._8_8_ = uStack_3d8;
                                  auVar36._0_8_ = local_3e0;
                                  auVar36._16_8_ = uStack_3d0;
                                  auVar36._24_8_ = uStack_3c8;
                                  if (auVar36 == (undefined1  [32])0x0) goto LAB_01d9df19;
                                  uVar43 = vptestmd_avx512vl(auVar36,auVar36);
                                  iVar107 = *(int *)(local_470.hit + 4);
                                  iVar254 = *(int *)(local_470.hit + 8);
                                  iVar30 = *(int *)(local_470.hit + 0xc);
                                  iVar31 = *(int *)(local_470.hit + 0x10);
                                  iVar32 = *(int *)(local_470.hit + 0x14);
                                  iVar33 = *(int *)(local_470.hit + 0x18);
                                  iVar34 = *(int *)(local_470.hit + 0x1c);
                                  bVar37 = (byte)uVar43;
                                  bVar18 = (bool)((byte)(uVar43 >> 1) & 1);
                                  bVar12 = (bool)((byte)(uVar43 >> 2) & 1);
                                  bVar13 = (bool)((byte)(uVar43 >> 3) & 1);
                                  bVar14 = (bool)((byte)(uVar43 >> 4) & 1);
                                  bVar15 = (bool)((byte)(uVar43 >> 5) & 1);
                                  bVar16 = (bool)((byte)(uVar43 >> 6) & 1);
                                  bVar17 = SUB81(uVar43 >> 7,0);
                                  *(uint *)(local_470.ray + 0x180) =
                                       (uint)(bVar37 & 1) * *(int *)local_470.hit |
                                       (uint)!(bool)(bVar37 & 1) * *(int *)(local_470.ray + 0x180);
                                  *(uint *)(local_470.ray + 0x184) =
                                       (uint)bVar18 * iVar107 |
                                       (uint)!bVar18 * *(int *)(local_470.ray + 0x184);
                                  *(uint *)(local_470.ray + 0x188) =
                                       (uint)bVar12 * iVar254 |
                                       (uint)!bVar12 * *(int *)(local_470.ray + 0x188);
                                  *(uint *)(local_470.ray + 0x18c) =
                                       (uint)bVar13 * iVar30 |
                                       (uint)!bVar13 * *(int *)(local_470.ray + 0x18c);
                                  *(uint *)(local_470.ray + 400) =
                                       (uint)bVar14 * iVar31 |
                                       (uint)!bVar14 * *(int *)(local_470.ray + 400);
                                  *(uint *)(local_470.ray + 0x194) =
                                       (uint)bVar15 * iVar32 |
                                       (uint)!bVar15 * *(int *)(local_470.ray + 0x194);
                                  *(uint *)(local_470.ray + 0x198) =
                                       (uint)bVar16 * iVar33 |
                                       (uint)!bVar16 * *(int *)(local_470.ray + 0x198);
                                  *(uint *)(local_470.ray + 0x19c) =
                                       (uint)bVar17 * iVar34 |
                                       (uint)!bVar17 * *(int *)(local_470.ray + 0x19c);
                                  iVar107 = *(int *)(local_470.hit + 0x24);
                                  iVar254 = *(int *)(local_470.hit + 0x28);
                                  iVar30 = *(int *)(local_470.hit + 0x2c);
                                  iVar31 = *(int *)(local_470.hit + 0x30);
                                  iVar32 = *(int *)(local_470.hit + 0x34);
                                  iVar33 = *(int *)(local_470.hit + 0x38);
                                  iVar34 = *(int *)(local_470.hit + 0x3c);
                                  bVar18 = (bool)((byte)(uVar43 >> 1) & 1);
                                  bVar12 = (bool)((byte)(uVar43 >> 2) & 1);
                                  bVar13 = (bool)((byte)(uVar43 >> 3) & 1);
                                  bVar14 = (bool)((byte)(uVar43 >> 4) & 1);
                                  bVar15 = (bool)((byte)(uVar43 >> 5) & 1);
                                  bVar16 = (bool)((byte)(uVar43 >> 6) & 1);
                                  bVar17 = SUB81(uVar43 >> 7,0);
                                  *(uint *)(local_470.ray + 0x1a0) =
                                       (uint)(bVar37 & 1) * *(int *)(local_470.hit + 0x20) |
                                       (uint)!(bool)(bVar37 & 1) * *(int *)(local_470.ray + 0x1a0);
                                  *(uint *)(local_470.ray + 0x1a4) =
                                       (uint)bVar18 * iVar107 |
                                       (uint)!bVar18 * *(int *)(local_470.ray + 0x1a4);
                                  *(uint *)(local_470.ray + 0x1a8) =
                                       (uint)bVar12 * iVar254 |
                                       (uint)!bVar12 * *(int *)(local_470.ray + 0x1a8);
                                  *(uint *)(local_470.ray + 0x1ac) =
                                       (uint)bVar13 * iVar30 |
                                       (uint)!bVar13 * *(int *)(local_470.ray + 0x1ac);
                                  *(uint *)(local_470.ray + 0x1b0) =
                                       (uint)bVar14 * iVar31 |
                                       (uint)!bVar14 * *(int *)(local_470.ray + 0x1b0);
                                  *(uint *)(local_470.ray + 0x1b4) =
                                       (uint)bVar15 * iVar32 |
                                       (uint)!bVar15 * *(int *)(local_470.ray + 0x1b4);
                                  *(uint *)(local_470.ray + 0x1b8) =
                                       (uint)bVar16 * iVar33 |
                                       (uint)!bVar16 * *(int *)(local_470.ray + 0x1b8);
                                  *(uint *)(local_470.ray + 0x1bc) =
                                       (uint)bVar17 * iVar34 |
                                       (uint)!bVar17 * *(int *)(local_470.ray + 0x1bc);
                                  iVar107 = *(int *)(local_470.hit + 0x44);
                                  iVar254 = *(int *)(local_470.hit + 0x48);
                                  iVar30 = *(int *)(local_470.hit + 0x4c);
                                  iVar31 = *(int *)(local_470.hit + 0x50);
                                  iVar32 = *(int *)(local_470.hit + 0x54);
                                  iVar33 = *(int *)(local_470.hit + 0x58);
                                  iVar34 = *(int *)(local_470.hit + 0x5c);
                                  bVar18 = (bool)((byte)(uVar43 >> 1) & 1);
                                  bVar12 = (bool)((byte)(uVar43 >> 2) & 1);
                                  bVar13 = (bool)((byte)(uVar43 >> 3) & 1);
                                  bVar14 = (bool)((byte)(uVar43 >> 4) & 1);
                                  bVar15 = (bool)((byte)(uVar43 >> 5) & 1);
                                  bVar16 = (bool)((byte)(uVar43 >> 6) & 1);
                                  bVar17 = SUB81(uVar43 >> 7,0);
                                  *(uint *)(local_470.ray + 0x1c0) =
                                       (uint)(bVar37 & 1) * *(int *)(local_470.hit + 0x40) |
                                       (uint)!(bool)(bVar37 & 1) * *(int *)(local_470.ray + 0x1c0);
                                  *(uint *)(local_470.ray + 0x1c4) =
                                       (uint)bVar18 * iVar107 |
                                       (uint)!bVar18 * *(int *)(local_470.ray + 0x1c4);
                                  *(uint *)(local_470.ray + 0x1c8) =
                                       (uint)bVar12 * iVar254 |
                                       (uint)!bVar12 * *(int *)(local_470.ray + 0x1c8);
                                  *(uint *)(local_470.ray + 0x1cc) =
                                       (uint)bVar13 * iVar30 |
                                       (uint)!bVar13 * *(int *)(local_470.ray + 0x1cc);
                                  *(uint *)(local_470.ray + 0x1d0) =
                                       (uint)bVar14 * iVar31 |
                                       (uint)!bVar14 * *(int *)(local_470.ray + 0x1d0);
                                  *(uint *)(local_470.ray + 0x1d4) =
                                       (uint)bVar15 * iVar32 |
                                       (uint)!bVar15 * *(int *)(local_470.ray + 0x1d4);
                                  *(uint *)(local_470.ray + 0x1d8) =
                                       (uint)bVar16 * iVar33 |
                                       (uint)!bVar16 * *(int *)(local_470.ray + 0x1d8);
                                  *(uint *)(local_470.ray + 0x1dc) =
                                       (uint)bVar17 * iVar34 |
                                       (uint)!bVar17 * *(int *)(local_470.ray + 0x1dc);
                                  iVar107 = *(int *)(local_470.hit + 100);
                                  iVar254 = *(int *)(local_470.hit + 0x68);
                                  iVar30 = *(int *)(local_470.hit + 0x6c);
                                  iVar31 = *(int *)(local_470.hit + 0x70);
                                  iVar32 = *(int *)(local_470.hit + 0x74);
                                  iVar33 = *(int *)(local_470.hit + 0x78);
                                  iVar34 = *(int *)(local_470.hit + 0x7c);
                                  bVar18 = (bool)((byte)(uVar43 >> 1) & 1);
                                  bVar12 = (bool)((byte)(uVar43 >> 2) & 1);
                                  bVar13 = (bool)((byte)(uVar43 >> 3) & 1);
                                  bVar14 = (bool)((byte)(uVar43 >> 4) & 1);
                                  bVar15 = (bool)((byte)(uVar43 >> 5) & 1);
                                  bVar16 = (bool)((byte)(uVar43 >> 6) & 1);
                                  bVar17 = SUB81(uVar43 >> 7,0);
                                  *(uint *)(local_470.ray + 0x1e0) =
                                       (uint)(bVar37 & 1) * *(int *)(local_470.hit + 0x60) |
                                       (uint)!(bool)(bVar37 & 1) * *(int *)(local_470.ray + 0x1e0);
                                  *(uint *)(local_470.ray + 0x1e4) =
                                       (uint)bVar18 * iVar107 |
                                       (uint)!bVar18 * *(int *)(local_470.ray + 0x1e4);
                                  *(uint *)(local_470.ray + 0x1e8) =
                                       (uint)bVar12 * iVar254 |
                                       (uint)!bVar12 * *(int *)(local_470.ray + 0x1e8);
                                  *(uint *)(local_470.ray + 0x1ec) =
                                       (uint)bVar13 * iVar30 |
                                       (uint)!bVar13 * *(int *)(local_470.ray + 0x1ec);
                                  *(uint *)(local_470.ray + 0x1f0) =
                                       (uint)bVar14 * iVar31 |
                                       (uint)!bVar14 * *(int *)(local_470.ray + 0x1f0);
                                  *(uint *)(local_470.ray + 500) =
                                       (uint)bVar15 * iVar32 |
                                       (uint)!bVar15 * *(int *)(local_470.ray + 500);
                                  *(uint *)(local_470.ray + 0x1f8) =
                                       (uint)bVar16 * iVar33 |
                                       (uint)!bVar16 * *(int *)(local_470.ray + 0x1f8);
                                  *(uint *)(local_470.ray + 0x1fc) =
                                       (uint)bVar17 * iVar34 |
                                       (uint)!bVar17 * *(int *)(local_470.ray + 0x1fc);
                                  iVar107 = *(int *)(local_470.hit + 0x84);
                                  iVar254 = *(int *)(local_470.hit + 0x88);
                                  iVar30 = *(int *)(local_470.hit + 0x8c);
                                  iVar31 = *(int *)(local_470.hit + 0x90);
                                  iVar32 = *(int *)(local_470.hit + 0x94);
                                  iVar33 = *(int *)(local_470.hit + 0x98);
                                  iVar34 = *(int *)(local_470.hit + 0x9c);
                                  bVar18 = (bool)((byte)(uVar43 >> 1) & 1);
                                  bVar12 = (bool)((byte)(uVar43 >> 2) & 1);
                                  bVar13 = (bool)((byte)(uVar43 >> 3) & 1);
                                  bVar14 = (bool)((byte)(uVar43 >> 4) & 1);
                                  bVar15 = (bool)((byte)(uVar43 >> 5) & 1);
                                  bVar16 = (bool)((byte)(uVar43 >> 6) & 1);
                                  bVar17 = SUB81(uVar43 >> 7,0);
                                  *(uint *)(local_470.ray + 0x200) =
                                       (uint)(bVar37 & 1) * *(int *)(local_470.hit + 0x80) |
                                       (uint)!(bool)(bVar37 & 1) * *(int *)(local_470.ray + 0x200);
                                  *(uint *)(local_470.ray + 0x204) =
                                       (uint)bVar18 * iVar107 |
                                       (uint)!bVar18 * *(int *)(local_470.ray + 0x204);
                                  *(uint *)(local_470.ray + 0x208) =
                                       (uint)bVar12 * iVar254 |
                                       (uint)!bVar12 * *(int *)(local_470.ray + 0x208);
                                  *(uint *)(local_470.ray + 0x20c) =
                                       (uint)bVar13 * iVar30 |
                                       (uint)!bVar13 * *(int *)(local_470.ray + 0x20c);
                                  *(uint *)(local_470.ray + 0x210) =
                                       (uint)bVar14 * iVar31 |
                                       (uint)!bVar14 * *(int *)(local_470.ray + 0x210);
                                  *(uint *)(local_470.ray + 0x214) =
                                       (uint)bVar15 * iVar32 |
                                       (uint)!bVar15 * *(int *)(local_470.ray + 0x214);
                                  *(uint *)(local_470.ray + 0x218) =
                                       (uint)bVar16 * iVar33 |
                                       (uint)!bVar16 * *(int *)(local_470.ray + 0x218);
                                  *(uint *)(local_470.ray + 0x21c) =
                                       (uint)bVar17 * iVar34 |
                                       (uint)!bVar17 * *(int *)(local_470.ray + 0x21c);
                                  auVar79 = vmovdqu32_avx512vl(*(undefined1 (*) [32])
                                                                (local_470.hit + 0xa0));
                                  *(undefined1 (*) [32])(local_470.ray + 0x220) = auVar79;
                                  auVar79 = vmovdqu32_avx512vl(*(undefined1 (*) [32])
                                                                (local_470.hit + 0xc0));
                                  *(undefined1 (*) [32])(local_470.ray + 0x240) = auVar79;
                                  auVar79 = vmovdqa32_avx512vl(*(undefined1 (*) [32])
                                                                (local_470.hit + 0xe0));
                                  *(undefined1 (*) [32])(local_470.ray + 0x260) = auVar79;
                                  auVar79 = vmovdqa32_avx512vl(*(undefined1 (*) [32])
                                                                (local_470.hit + 0x100));
                                  *(undefined1 (*) [32])(local_470.ray + 0x280) = auVar79;
                                }
                                auVar61 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                                auVar247 = ZEXT1664(auVar61);
                                auVar61 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                                auVar252 = ZEXT1664(auVar61);
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                  break;
                }
                lVar44 = lVar44 + -1;
              } while (lVar44 != 0);
            }
          }
          else {
            auVar61 = vxorps_avx512vl(ZEXT416(5),auVar60);
            auVar255 = ZEXT1664(auVar61);
          }
        }
        else {
          auVar246 = ZEXT1664(auVar244);
        }
      }
    } while (bVar11);
    auVar56 = vinsertps_avx512f(auVar49,auVar56,0x10);
  } while( true );
}

Assistant:

static __forceinline void intersect_hn(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff p0,t0,p1,t1; Vec3fa n0,dn0,n1,dn1; geom->gather_hermite(p0,t0,n0,dn0,p1,t1,n1,dn1,geom->curve(primID));
          Intersector().intersect(pre,ray,k,context,geom,primID,p0,t0,p1,t1,n0,dn0,n1,dn1,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }